

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86_avx512::forward
          (Eltwise_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [12];
  undefined1 auVar27 [56];
  undefined1 auVar28 [24];
  ulong uVar29;
  size_type sVar30;
  float *pfVar31;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  __m128 _p1_23;
  __m128 _p_23;
  __m256 _p1_22;
  __m256 _p_22;
  __m512 _p1_21;
  __m512 _p_21;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m128 _p1_20;
  __m128 _p_20;
  __m256 _p1_19;
  __m256 _p_19;
  __m512 _p1_18;
  __m512 _p_18;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m128 _p_17;
  __m128 _p1_17;
  __m128 _coeff;
  __m256 _p1_16;
  __m256 _p_16;
  __m256 _coeff_avx;
  __m512 _p1_15;
  __m512 _p_15;
  __m512 _coeff_avx512;
  int i_5;
  float coeff;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m128 _p1_14;
  __m128 _p_14;
  __m128 _coeff1;
  __m128 _coeff0;
  __m256 _p1_13;
  __m256 _p_13;
  __m256 _coeff1_avx;
  __m256 _coeff0_avx;
  __m512 _p1_12;
  __m512 _p_12;
  __m512 _coeff1_avx512;
  __m512 _coeff0_avx512;
  int i_4;
  float coeff1;
  float coeff0;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  Mat *bottom_blob1_2;
  __m128 _p1_11;
  __m128 _p_11;
  __m256 _p1_10;
  __m256 _p_10;
  __m512 _p1_9;
  __m512 _p_9;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m128 _p1_8;
  __m128 _p_8;
  __m256 _p1_7;
  __m256 _p_7;
  __m512 _p1_6;
  __m512 _p_6;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m128 _p1_5;
  __m128 _p_5;
  __m256 _p1_4;
  __m256 _p_4;
  __m512 _p1_3;
  __m512 _p_3;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m128 _p1_2;
  __m128 _p_2;
  __m256 _p1_1;
  __m256 _p_1;
  __m512 _p1;
  __m512 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m_18;
  Mat *m_16;
  Mat *m_15;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_19;
  Mat *m_17;
  Mat *m_14;
  Mat *m_12;
  Mat *m_9;
  Mat *m_7;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_ffffffffffffc698;
  Mat *in_stack_ffffffffffffc6a0;
  Mat *in_stack_ffffffffffffc6a8;
  undefined8 local_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 uStack_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  int local_34dc;
  undefined8 local_34d8;
  undefined8 local_34d0;
  undefined8 local_34c8;
  undefined4 local_34c0;
  Allocator *local_34b8;
  undefined4 local_34b0;
  undefined4 local_34ac;
  undefined4 local_34a8;
  undefined4 local_34a4;
  undefined4 local_34a0;
  undefined8 local_3498;
  undefined1 (*local_3490) [64];
  undefined8 local_3488;
  undefined8 local_3480;
  undefined8 local_3478;
  undefined4 local_3470;
  Allocator *local_3468;
  undefined4 local_3460;
  undefined4 local_345c;
  undefined4 local_3458;
  undefined4 local_3454;
  undefined4 local_3450;
  undefined8 local_3448;
  undefined1 (*local_3440) [64];
  int local_3434;
  const_reference local_3430;
  ulong local_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined1 local_3410 [16];
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined1 local_33e0 [32];
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 uStack_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined1 local_3380 [64];
  int local_3314;
  undefined8 local_3310;
  undefined8 local_3308;
  undefined8 local_3300;
  undefined4 local_32f8;
  Allocator *local_32f0;
  undefined4 local_32e8;
  undefined4 local_32e4;
  undefined4 local_32e0;
  undefined4 local_32dc;
  undefined4 local_32d8;
  undefined8 local_32d0;
  undefined1 (*local_32c8) [64];
  undefined8 local_32c0;
  undefined8 local_32b8;
  undefined8 local_32b0;
  undefined4 local_32a8;
  Allocator *local_32a0;
  undefined4 local_3298;
  undefined4 local_3294;
  undefined4 local_3290;
  undefined4 local_328c;
  undefined4 local_3288;
  undefined8 local_3280;
  undefined1 (*local_3278) [64];
  undefined8 local_3270;
  undefined8 local_3268;
  undefined8 local_3260;
  undefined4 local_3258;
  Allocator *local_3250;
  undefined4 local_3248;
  undefined4 local_3244;
  undefined4 local_3240;
  undefined4 local_323c;
  undefined4 local_3238;
  undefined8 local_3230;
  undefined1 (*local_3228) [64];
  int local_321c;
  const_reference local_3218;
  undefined8 local_3210;
  undefined8 uStack_3208;
  float local_3200;
  float fStack_31fc;
  float fStack_31f8;
  float fStack_31f4;
  undefined1 local_31f0 [16];
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined1 local_31c0 [32];
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 uStack_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined1 local_3140 [64];
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 uStack_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  int local_30c0;
  float local_30bc;
  undefined8 local_30b8;
  undefined8 local_30b0;
  undefined8 local_30a8;
  undefined4 local_30a0;
  Allocator *local_3098;
  undefined4 local_3090;
  undefined4 local_308c;
  undefined4 local_3088;
  undefined4 local_3084;
  undefined4 local_3080;
  undefined8 local_3078;
  undefined1 (*local_3070) [64];
  undefined8 local_3068;
  undefined8 local_3060;
  undefined8 local_3058;
  undefined4 local_3050;
  Allocator *local_3048;
  undefined4 local_3040;
  undefined4 local_303c;
  undefined4 local_3038;
  undefined4 local_3034;
  undefined4 local_3030;
  undefined8 local_3028;
  undefined1 (*local_3020) [64];
  int local_3014;
  const_reference local_3010;
  ulong local_3008;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  undefined8 local_2ff0;
  undefined8 uStack_2fe8;
  undefined1 local_2fe0 [16];
  undefined8 local_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined1 local_2fa0 [8];
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined1 local_2f00 [64];
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 uStack_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  int local_2e2c;
  float local_2e28;
  float local_2e24;
  undefined8 local_2e20;
  undefined8 local_2e18;
  undefined8 local_2e10;
  undefined4 local_2e08;
  Allocator *local_2e00;
  undefined4 local_2df8;
  undefined4 local_2df4;
  undefined4 local_2df0;
  undefined4 local_2dec;
  undefined4 local_2de8;
  undefined8 local_2de0;
  undefined1 (*local_2dd8) [16];
  undefined8 local_2dd0;
  undefined8 local_2dc8;
  undefined8 local_2dc0;
  undefined4 local_2db8;
  Allocator *local_2db0;
  undefined4 local_2da8;
  undefined4 local_2da4;
  undefined4 local_2da0;
  undefined4 local_2d9c;
  undefined4 local_2d98;
  undefined8 local_2d90;
  undefined1 (*local_2d88) [64];
  undefined8 local_2d80;
  undefined8 local_2d78;
  undefined8 local_2d70;
  undefined4 local_2d68;
  Allocator *local_2d60;
  undefined4 local_2d58;
  undefined4 local_2d54;
  undefined4 local_2d50;
  undefined4 local_2d4c;
  undefined4 local_2d48;
  undefined8 local_2d40;
  undefined1 (*local_2d38) [64];
  int local_2d2c;
  const_reference local_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  float local_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float fStack_2d04;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  float local_2ce0;
  float fStack_2cdc;
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined1 local_2c80 [64];
  int local_2c1c;
  undefined8 local_2c18;
  undefined8 local_2c10;
  undefined8 local_2c08;
  undefined4 local_2c00;
  Allocator *local_2bf8;
  undefined4 local_2bf0;
  undefined4 local_2bec;
  undefined4 local_2be8;
  undefined4 local_2be4;
  undefined4 local_2be0;
  undefined8 local_2bd8;
  undefined1 (*local_2bd0) [64];
  undefined8 local_2bc8;
  undefined8 local_2bc0;
  undefined8 local_2bb8;
  undefined4 local_2bb0;
  Allocator *local_2ba8;
  undefined4 local_2ba0;
  undefined4 local_2b9c;
  undefined4 local_2b98;
  undefined4 local_2b94;
  undefined4 local_2b90;
  undefined8 local_2b88;
  undefined1 (*local_2b80) [64];
  int local_2b74;
  const_reference local_2b70;
  ulong local_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  float local_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  float fStack_2b44;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined1 local_2ac0 [64];
  int local_2a64;
  undefined8 local_2a60;
  undefined8 local_2a58;
  undefined8 local_2a50;
  undefined4 local_2a48;
  Allocator *local_2a40;
  undefined4 local_2a38;
  undefined4 local_2a34;
  undefined4 local_2a30;
  undefined4 local_2a2c;
  undefined4 local_2a28;
  undefined8 local_2a20;
  undefined1 (*local_2a18) [64];
  undefined8 local_2a10;
  undefined8 local_2a08;
  undefined8 local_2a00;
  undefined4 local_29f8;
  Allocator *local_29f0;
  undefined4 local_29e8;
  undefined4 local_29e4;
  undefined4 local_29e0;
  undefined4 local_29dc;
  undefined4 local_29d8;
  undefined8 local_29d0;
  undefined1 (*local_29c8) [64];
  undefined8 local_29c0;
  undefined8 local_29b8;
  undefined8 local_29b0;
  undefined4 local_29a8;
  Allocator *local_29a0;
  undefined4 local_2998;
  undefined4 local_2994;
  undefined4 local_2990;
  undefined4 local_298c;
  undefined4 local_2988;
  undefined8 local_2980;
  undefined1 (*local_2978) [64];
  int local_296c;
  const_reference local_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  float local_2950;
  float fStack_294c;
  float fStack_2948;
  float fStack_2944;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  float local_2920;
  float fStack_291c;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  undefined4 uStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined1 local_28c0 [64];
  int local_285c;
  undefined8 local_2858;
  undefined8 local_2850;
  undefined8 local_2848;
  undefined4 local_2840;
  Allocator *local_2838;
  undefined4 local_2830;
  undefined4 local_282c;
  undefined4 local_2828;
  undefined4 local_2824;
  undefined4 local_2820;
  undefined8 local_2818;
  undefined1 (*local_2810) [64];
  undefined8 local_2808;
  undefined8 local_2800;
  undefined8 local_27f8;
  undefined4 local_27f0;
  Allocator *local_27e8;
  undefined4 local_27e0;
  undefined4 local_27dc;
  undefined4 local_27d8;
  undefined4 local_27d4;
  undefined4 local_27d0;
  undefined8 local_27c8;
  undefined1 (*local_27c0) [64];
  int local_27b4;
  const_reference local_27b0;
  ulong local_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  float local_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined4 uStack_2744;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [64];
  int local_268c;
  undefined8 local_2688;
  undefined8 local_2680;
  undefined8 local_2678;
  undefined4 local_2670;
  Allocator *local_2668;
  undefined4 local_2660;
  undefined4 local_265c;
  undefined4 local_2658;
  undefined4 local_2654;
  undefined4 local_2650;
  undefined8 local_2648;
  undefined1 (*local_2640) [64];
  undefined8 local_2638;
  undefined8 local_2630;
  undefined8 local_2628;
  undefined4 local_2620;
  Allocator *local_2618;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined4 local_2604;
  undefined4 local_2600;
  undefined8 local_25f8;
  undefined1 (*local_25f0) [64];
  undefined8 local_25d8;
  undefined8 local_25d0;
  undefined8 local_25c8;
  undefined4 local_25c0;
  Allocator *local_25b8;
  undefined4 local_25b0;
  undefined4 local_25ac;
  undefined4 local_25a8;
  undefined4 local_25a4;
  undefined4 local_25a0;
  undefined8 local_2598;
  undefined1 (*local_2590) [64];
  int local_2584;
  const_reference local_2580;
  reference local_2578;
  int local_256c;
  int local_2568;
  int local_2564;
  int local_2560;
  int local_255c;
  const_reference local_2558;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2548;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2540;
  int local_252c;
  reference local_2528;
  undefined1 local_251d;
  int local_251c;
  const_reference local_2518;
  undefined8 *local_2510;
  undefined1 local_2505;
  int local_2504;
  const_reference local_2500;
  undefined8 *local_24f8;
  undefined1 local_24ed;
  int local_24ec;
  const_reference local_24e8;
  undefined8 *local_24e0;
  undefined1 local_24d5;
  int local_24d4;
  const_reference local_24d0;
  undefined8 *local_24c8;
  undefined1 local_24bd;
  int local_24bc;
  const_reference local_24b8;
  undefined8 *local_24b0;
  undefined1 local_24a5;
  int local_24a4;
  const_reference local_24a0;
  undefined8 *local_2498;
  undefined1 local_248d;
  int local_248c;
  const_reference local_2488;
  undefined8 *local_2480;
  undefined1 local_2475;
  int local_2474;
  const_reference local_2470;
  undefined8 *local_2468;
  undefined1 local_245d;
  int local_245c;
  const_reference local_2458;
  undefined8 *local_2450;
  undefined1 local_2445;
  int local_2444;
  const_reference local_2440;
  undefined8 *local_2438;
  undefined1 local_242d;
  int local_242c;
  const_reference local_2428;
  undefined8 *local_2420;
  undefined1 local_2415;
  int local_2414;
  const_reference local_2410;
  undefined8 *local_2408;
  undefined8 *local_2400;
  undefined8 *local_23f8;
  undefined8 *local_23f0;
  undefined8 *local_23e8;
  undefined8 *local_23e0;
  undefined8 *local_23d8;
  undefined8 *local_23d0;
  undefined8 *local_23c8;
  undefined8 *local_23c0;
  undefined8 *local_23b8;
  undefined8 *local_23b0;
  undefined8 *local_23a8;
  undefined8 *local_2340;
  undefined8 *local_2330;
  undefined8 *local_2320;
  undefined8 *local_2310;
  undefined8 *local_2300;
  undefined8 *local_22f0;
  undefined8 *local_22e0;
  undefined8 *local_22d0;
  undefined8 *local_22c0;
  undefined8 *local_22b0;
  undefined8 *local_22a0;
  undefined8 *local_2290;
  undefined8 *local_2280;
  undefined8 *local_2270;
  undefined8 *local_2260;
  undefined8 *local_2250;
  undefined8 *local_2240;
  undefined8 *local_2230;
  undefined8 *local_2220;
  undefined8 *local_2210;
  undefined1 local_21fd;
  int local_21fc;
  reference local_21f8;
  undefined8 *local_21f0;
  undefined1 local_21dd;
  int local_21dc;
  reference local_21d8;
  undefined8 *local_21d0;
  undefined1 local_21bd;
  int local_21bc;
  reference local_21b8;
  undefined8 *local_21b0;
  undefined1 local_219d;
  int local_219c;
  reference local_2198;
  undefined8 *local_2190;
  undefined1 local_217d;
  int local_217c;
  reference local_2178;
  undefined8 *local_2170;
  undefined1 local_215d;
  int local_215c;
  reference local_2158;
  undefined8 *local_2150;
  undefined1 local_213d;
  int local_213c;
  reference local_2138;
  undefined8 *local_2130;
  undefined1 local_211d;
  int local_211c;
  reference local_2118;
  undefined8 *local_2110;
  undefined8 *local_2100;
  undefined8 *local_20f8;
  undefined8 *local_20f0;
  undefined8 *local_20e8;
  undefined8 *local_20e0;
  undefined8 *local_20d8;
  undefined8 *local_20d0;
  undefined8 *local_20c8;
  undefined1 (*local_20c0) [64];
  undefined1 (*local_20b8) [64];
  undefined1 (*local_20b0) [64];
  undefined1 (*local_20a8) [64];
  undefined1 (*local_20a0) [64];
  undefined1 (*local_2098) [64];
  undefined1 (*local_2090) [64];
  undefined1 (*local_2088) [64];
  undefined1 (*local_2080) [64];
  undefined1 (*local_2078) [64];
  undefined1 (*local_2070) [64];
  undefined1 (*local_2068) [64];
  undefined1 (*local_2060) [64];
  undefined1 (*local_2058) [64];
  undefined1 (*local_2050) [64];
  undefined1 (*local_2048) [64];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [64];
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [64];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 (*local_1e48) [64];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 (*local_1dc8) [64];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined1 (*local_1d48) [64];
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined1 (*local_1cc8) [16];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined1 (*local_1c48) [64];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 (*local_1bc8) [64];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 (*local_1b48) [64];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined1 (*local_1ae8) [64];
  undefined1 (*local_1ae0) [64];
  undefined1 (*local_1ad8) [64];
  undefined1 (*local_1ad0) [64];
  undefined1 (*local_1ac8) [64];
  undefined1 (*local_1ac0) [64];
  undefined1 (*local_1ab8) [64];
  undefined1 (*local_1ab0) [64];
  undefined1 (*local_1aa8) [64];
  undefined1 (*local_1aa0) [64];
  undefined1 (*local_1a98) [64];
  undefined1 (*local_1a90) [64];
  undefined1 (*local_1a88) [64];
  undefined1 (*local_1a80) [64];
  undefined1 (*local_1a78) [64];
  undefined1 (*local_1a70) [64];
  undefined1 (*local_1a68) [64];
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined1 local_1a00 [8];
  float fStack_19f8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined1 local_19c0 [8];
  float fStack_19b8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined1 (*local_1968) [64];
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined1 (*local_1928) [64];
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined1 (*local_18e8) [64];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined1 (*local_18a8) [16];
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 (*local_1868) [64];
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined1 (*local_1828) [64];
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined1 (*local_17e8) [64];
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined1 (*local_17a8) [64];
  undefined1 (*local_17a0) [64];
  undefined1 (*local_1798) [64];
  undefined1 (*local_1790) [64];
  undefined1 (*local_1788) [64];
  undefined1 (*local_1780) [64];
  undefined1 (*local_1778) [64];
  undefined1 (*local_1770) [64];
  undefined1 (*local_1768) [64];
  undefined1 (*local_1760) [64];
  undefined1 (*local_1758) [64];
  undefined1 (*local_1750) [64];
  undefined1 (*local_1748) [64];
  undefined1 (*local_1740) [64];
  undefined1 (*local_1738) [64];
  undefined1 (*local_1730) [64];
  undefined1 (*local_1728) [64];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 local_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined1 local_16b0 [8];
  float fStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined1 local_1690 [8];
  float fStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined1 (*local_1668) [64];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined1 (*local_1648) [64];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined1 (*local_1628) [64];
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined1 (*local_1608) [16];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined1 (*local_15e8) [64];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined1 (*local_15c8) [64];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined1 (*local_15a8) [64];
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined1 (*local_1588) [64];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [64];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [64];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [8];
  float fStack_1458;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [8];
  float fStack_1418;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [16];
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [16];
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [8];
  float fStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [8];
  float fStack_1378;
  size_type local_1370;
  long *local_1368;
  undefined8 local_1360;
  long *local_1358;
  undefined8 local_1350;
  undefined8 *local_1348;
  undefined1 local_1340 [64];
  float local_12c4;
  undefined1 local_12c0 [64];
  float local_1244;
  undefined1 local_1240 [64];
  float local_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_102c;
  float local_1028;
  float local_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float local_f44;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float local_f24;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float local_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  reference local_d28;
  Allocator *local_d20;
  int local_d14;
  size_t local_d10;
  undefined1 (*local_d08) [64];
  int local_cfc;
  int local_cf8;
  int local_cf4;
  undefined8 *local_cf0;
  Allocator *local_ce8;
  int local_cdc;
  size_t local_cd8;
  undefined1 (*local_cd0) [64];
  int local_cc4;
  int local_cc0;
  int local_cbc;
  undefined8 *local_cb8;
  Allocator *local_cb0;
  int local_ca4;
  size_t local_ca0;
  undefined1 (*local_c98) [64];
  int local_c8c;
  int local_c88;
  int local_c84;
  undefined8 *local_c80;
  Allocator *local_c78;
  int local_c6c;
  size_t local_c68;
  undefined1 (*local_c60) [64];
  int local_c54;
  int local_c50;
  int local_c4c;
  undefined8 *local_c48;
  Allocator *local_c40;
  int local_c34;
  size_t local_c30;
  undefined1 (*local_c28) [16];
  int local_c1c;
  int local_c18;
  int local_c14;
  undefined8 *local_c10;
  Allocator *local_c08;
  int local_bfc;
  size_t local_bf8;
  undefined1 (*local_bf0) [64];
  int local_be4;
  int local_be0;
  int local_bdc;
  undefined8 *local_bd8;
  Allocator *local_bd0;
  int local_bc4;
  size_t local_bc0;
  undefined1 (*local_bb8) [64];
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 *local_ba0;
  Allocator *local_b98;
  int local_b8c;
  size_t local_b88;
  undefined1 (*local_b80) [64];
  int local_b74;
  int local_b70;
  int local_b6c;
  undefined8 *local_b68;
  Allocator *local_b60;
  int local_b54;
  size_t local_b50;
  undefined1 (*local_b48) [64];
  int local_b3c;
  int local_b38;
  int local_b34;
  undefined8 *local_b30;
  Allocator *local_b28;
  int local_b1c;
  size_t local_b18;
  undefined1 (*local_b10) [64];
  int local_b04;
  int local_b00;
  int local_afc;
  undefined8 *local_af8;
  Allocator *local_af0;
  int local_ae4;
  size_t local_ae0;
  undefined1 (*local_ad8) [64];
  int local_acc;
  int local_ac8;
  int local_ac4;
  undefined8 *local_ac0;
  Allocator *local_ab8;
  int local_aac;
  size_t local_aa8;
  undefined1 (*local_aa0) [64];
  int local_a94;
  int local_a90;
  int local_a8c;
  undefined8 *local_a88;
  Allocator *local_a80;
  int local_a74;
  size_t local_a70;
  undefined1 (*local_a68) [64];
  int local_a5c;
  int local_a58;
  int local_a54;
  undefined8 *local_a50;
  Allocator *local_a48;
  int local_a3c;
  size_t local_a38;
  undefined1 (*local_a30) [64];
  int local_a24;
  int local_a20;
  int local_a1c;
  undefined8 *local_a18;
  Allocator *local_a10;
  int local_a04;
  size_t local_a00;
  undefined1 (*local_9f8) [64];
  int local_9ec;
  int local_9e8;
  int local_9e4;
  undefined8 *local_9e0;
  Allocator *local_9d8;
  int local_9cc;
  size_t local_9c8;
  undefined1 (*local_9c0) [64];
  int local_9b4;
  int local_9b0;
  int local_9ac;
  undefined8 *local_9a8;
  Allocator *local_9a0;
  int local_994;
  size_t local_990;
  undefined1 (*local_988) [64];
  int local_97c;
  int local_978;
  int local_974;
  undefined8 *local_970;
  Allocator *local_968;
  int local_95c;
  size_t local_958;
  undefined1 (*local_950) [64];
  int local_944;
  int local_940;
  int local_93c;
  undefined8 *local_938;
  Allocator *local_930;
  int local_924;
  size_t local_920;
  undefined1 (*local_918) [64];
  int local_90c;
  int local_908;
  int local_904;
  undefined8 *local_900;
  Allocator *local_8f8;
  int local_8ec;
  size_t local_8e8;
  undefined1 (*local_8e0) [64];
  int local_8d4;
  int local_8d0;
  int local_8cc;
  undefined8 *local_8c8;
  undefined4 local_8bc;
  long local_8b8;
  undefined4 local_8ac;
  long local_8a8;
  undefined4 local_89c;
  long local_898;
  undefined4 local_88c;
  long local_888;
  undefined4 local_87c;
  long local_878;
  undefined4 local_86c;
  long local_868;
  undefined4 local_85c;
  long local_858;
  undefined4 local_84c;
  long local_848;
  undefined4 local_83c;
  long local_838;
  undefined4 local_82c;
  long local_828;
  undefined4 local_81c;
  long local_818;
  undefined4 local_80c;
  long local_808;
  undefined4 local_7fc;
  long local_7f8;
  undefined4 local_7ec;
  long local_7e8;
  undefined4 local_7dc;
  long local_7d8;
  undefined4 local_7cc;
  long local_7c8;
  undefined4 local_7bc;
  long local_7b8;
  undefined4 local_7ac;
  long local_7a8;
  undefined4 local_79c;
  long local_798;
  undefined4 local_78c;
  long local_788;
  undefined8 *local_6e8;
  undefined8 *local_6c8;
  undefined8 *local_6a8;
  undefined8 *local_688;
  undefined8 *local_668;
  undefined8 *local_648;
  undefined8 *local_628;
  undefined8 *local_608;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  undefined8 *local_5a8;
  undefined8 *local_588;
  undefined8 *local_568;
  undefined8 *local_548;
  undefined8 *local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  undefined1 local_1a0 [32];
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  undefined1 local_160 [32];
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_2548 = in_RDX;
  local_2540 = in_RSI;
  local_2558 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_255c = local_2558->w;
  local_2560 = local_2558->h;
  local_2564 = local_2558->c;
  local_2568 = local_2558->elempack;
  local_256c = local_255c * local_2560 * local_2568;
  local_2578 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2548,0);
  Mat::create_like(in_stack_ffffffffffffc6a8,in_stack_ffffffffffffc6a0,in_stack_ffffffffffffc698);
  local_2528 = local_2578;
  bVar32 = true;
  if (local_2578->data != (void *)0x0) {
    local_d28 = local_2578;
    bVar32 = local_2578->cstep * (long)local_2578->c == 0;
  }
  if (bVar32) {
    local_252c = -100;
  }
  else {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_2580 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2540,1);
      for (local_2584 = 0; local_2584 < local_2564; local_2584 = local_2584 + 1) {
        local_2408 = &local_25d8;
        local_b34 = local_2558->w;
        local_b38 = local_2558->h;
        local_b3c = local_2558->d;
        local_b48 = (undefined1 (*) [64])
                    ((long)local_2558->data +
                    local_2558->cstep * (long)local_2584 * local_2558->elemsize);
        local_b50 = local_2558->elemsize;
        local_b54 = local_2558->elempack;
        local_b60 = local_2558->allocator;
        local_b30 = &local_25d8;
        local_808 = (long)local_b34 * (long)local_b38 * local_b50;
        local_23a8 = &local_25d8;
        local_2340 = &local_25d8;
        local_2420 = &local_2638;
        local_afc = local_2580->w;
        local_b00 = local_2580->h;
        local_b04 = local_2580->d;
        local_b10 = (undefined1 (*) [64])
                    ((long)local_2580->data +
                    local_2580->cstep * (long)local_2584 * local_2580->elemsize);
        local_b18 = local_2580->elemsize;
        local_b1c = local_2580->elempack;
        local_b28 = local_2580->allocator;
        local_af8 = &local_2638;
        local_818 = (long)local_afc * (long)local_b00 * local_b18;
        local_23b0 = &local_2638;
        local_2330 = &local_2638;
        local_25a0 = 0;
        local_25a4 = 0;
        local_25a8 = 0;
        local_25ac = 0;
        local_25c0 = 0;
        local_25c8 = 0;
        local_25d0 = 0;
        local_25d8 = 0;
        local_80c = 0x10;
        local_81c = 0x10;
        local_2410 = local_2558;
        local_2414 = local_2584;
        local_2415 = 1;
        local_242c = local_2584;
        local_242d = 1;
        local_2598 = 0;
        local_25b0 = 0;
        local_2638 = 0;
        local_2628 = 0;
        local_2620 = 0;
        local_260c = 0;
        local_2608 = 0;
        local_2604 = 0;
        local_2600 = 0;
        local_2630 = 0;
        local_2110 = &local_2688;
        local_cf4 = local_2578->w;
        local_cf8 = local_2578->h;
        local_cfc = local_2578->d;
        local_d08 = (undefined1 (*) [64])
                    ((long)local_2578->data +
                    local_2578->cstep * (long)local_2584 * local_2578->elemsize);
        local_d10 = local_2578->elemsize;
        local_d14 = local_2578->elempack;
        local_d20 = local_2578->allocator;
        local_cf0 = &local_2688;
        local_788 = (long)local_cf4 * (long)local_cf8 * local_d10;
        local_78c = 0x10;
        local_2118 = local_2578;
        local_211c = local_2584;
        local_211d = 1;
        local_25f8 = 0;
        local_2610 = 0;
        local_20c8 = &local_2688;
        local_2320 = &local_2688;
        local_2688 = 0;
        local_2678 = 0;
        local_2670 = 0;
        local_2660 = 0;
        local_265c = 0;
        local_2658 = 0;
        local_2654 = 0;
        local_2650 = 0;
        local_2648 = 0;
        local_2680 = 0;
        local_2640 = local_d08;
        local_25f0 = local_b10;
        local_2590 = local_b48;
        for (local_268c = 0; local_268c + 0xf < local_256c; local_268c = local_268c + 0x10) {
          local_2048 = local_2590;
          local_1f00 = *local_2590;
          local_2050 = local_25f0;
          local_2740 = *(undefined8 *)*local_25f0;
          uStack_2738 = *(undefined8 *)(*local_25f0 + 8);
          uStack_2730 = *(undefined8 *)(*local_25f0 + 0x10);
          uStack_2728 = *(undefined8 *)(*local_25f0 + 0x18);
          uStack_2720 = *(undefined8 *)(*local_25f0 + 0x20);
          uStack_2718 = *(undefined8 *)(*local_25f0 + 0x28);
          uStack_2710 = *(undefined8 *)(*local_25f0 + 0x30);
          uStack_2708 = *(undefined8 *)(*local_25f0 + 0x38);
          local_2700 = vmulps_avx512f(local_1f00,*local_25f0);
          local_1ae8 = local_2640;
          local_1b40 = local_2700._0_8_;
          uStack_1b38 = local_2700._8_8_;
          uStack_1b30 = local_2700._16_8_;
          uStack_1b28 = local_2700._24_8_;
          uStack_1b20 = local_2700._32_8_;
          uStack_1b18 = local_2700._40_8_;
          uStack_1b10 = local_2700._48_8_;
          uStack_1b08 = local_2700._56_8_;
          *local_2640 = local_2700;
          local_2590 = local_2590 + 1;
          local_25f0 = local_25f0 + 1;
          local_2640 = local_2640 + 1;
          local_1f40 = local_2740;
          uStack_1f38 = uStack_2738;
          uStack_1f30 = uStack_2730;
          uStack_1f28 = uStack_2728;
          uStack_1f20 = uStack_2720;
          uStack_1f18 = uStack_2718;
          uStack_1f10 = uStack_2710;
          uStack_1f08 = uStack_2708;
        }
        for (; local_268c + 7 < local_256c; local_268c = local_268c + 8) {
          local_1a68 = local_2590;
          auVar26 = *(undefined1 (*) [12])*local_2590;
          fStack_2754 = (float)((ulong)*(undefined8 *)(*local_2590 + 8) >> 0x20);
          fStack_2750 = (float)*(undefined8 *)(*local_2590 + 0x10);
          fStack_274c = (float)((ulong)*(undefined8 *)(*local_2590 + 0x10) >> 0x20);
          fStack_2748 = (float)*(undefined8 *)(*local_2590 + 0x18);
          uStack_2744 = (undefined4)((ulong)*(undefined8 *)(*local_2590 + 0x18) >> 0x20);
          local_1a70 = local_25f0;
          local_2780 = *(undefined8 *)*local_25f0;
          uStack_2778 = *(undefined8 *)(*local_25f0 + 8);
          uStack_2770 = *(undefined8 *)(*local_25f0 + 0x10);
          uStack_2768 = *(undefined8 *)(*local_25f0 + 0x18);
          auVar3._12_4_ = fStack_2754;
          auVar3._0_12_ = auVar26;
          auVar3._16_4_ = fStack_2750;
          auVar3._20_4_ = fStack_274c;
          auVar3._24_4_ = fStack_2748;
          auVar3._28_4_ = uStack_2744;
          local_19c0._0_4_ = auVar26._0_4_;
          local_19c0._4_4_ = auVar26._4_4_;
          fStack_19b8 = auVar26._8_4_;
          local_19e0._0_4_ = (float)local_2780;
          local_19e0._4_4_ = (float)((ulong)local_2780 >> 0x20);
          uStack_19d8._0_4_ = (float)uStack_2778;
          uStack_19d8._4_4_ = (float)((ulong)uStack_2778 >> 0x20);
          uStack_19d0._0_4_ = (float)uStack_2770;
          uStack_19d0._4_4_ = (float)((ulong)uStack_2770 >> 0x20);
          uStack_19c8._0_4_ = (float)uStack_2768;
          local_2760 = (float)local_19c0._0_4_ * (float)local_19e0;
          fStack_275c = (float)local_19c0._4_4_ * local_19e0._4_4_;
          fStack_2758 = fStack_19b8 * (float)uStack_19d8;
          fStack_2754 = fStack_2754 * uStack_19d8._4_4_;
          fStack_2750 = fStack_2750 * (float)uStack_19d0;
          fStack_274c = fStack_274c * uStack_19d0._4_4_;
          fStack_2748 = fStack_2748 * (float)uStack_19c8;
          local_17a8 = local_2640;
          local_17e0 = CONCAT44(fStack_275c,local_2760);
          uStack_17d8 = CONCAT44(fStack_2754,fStack_2758);
          uStack_17d0 = CONCAT44(fStack_274c,fStack_2750);
          uStack_17c8 = CONCAT44(uStack_2744,fStack_2748);
          auVar17._8_8_ = uStack_17d8;
          auVar17._0_8_ = local_17e0;
          auVar17._16_8_ = uStack_17d0;
          auVar17._24_8_ = uStack_17c8;
          *(undefined1 (*) [32])*local_2640 = auVar17;
          local_2590 = (undefined1 (*) [64])(*local_2590 + 0x20);
          local_25f0 = (undefined1 (*) [64])(*local_25f0 + 0x20);
          local_2640 = (undefined1 (*) [64])((long)*local_2640 + 0x20);
          local_19e0 = local_2780;
          uStack_19d8 = uStack_2778;
          uStack_19d0 = uStack_2770;
          uStack_19c8 = uStack_2768;
          _local_19c0 = auVar3;
        }
        for (; local_268c + 3 < local_256c; local_268c = local_268c + 4) {
          local_1728 = local_2590;
          auVar26 = *(undefined1 (*) [12])*local_2590;
          fStack_2784 = (float)((ulong)*(undefined8 *)(*local_2590 + 8) >> 0x20);
          local_1730 = local_25f0;
          local_27a0 = *(undefined8 *)*local_25f0;
          uStack_2798 = *(undefined8 *)(*local_25f0 + 8);
          auVar2._12_4_ = fStack_2784;
          auVar2._0_12_ = auVar26;
          local_1690._0_4_ = auVar26._0_4_;
          local_1690._4_4_ = auVar26._4_4_;
          fStack_1688 = auVar26._8_4_;
          local_16a0._0_4_ = (float)local_27a0;
          local_16a0._4_4_ = (float)((ulong)local_27a0 >> 0x20);
          uStack_1698._0_4_ = (float)uStack_2798;
          uStack_1698._4_4_ = (float)((ulong)uStack_2798 >> 0x20);
          local_2790 = (float)local_1690._0_4_ * (float)local_16a0;
          fStack_278c = (float)local_1690._4_4_ * local_16a0._4_4_;
          fStack_2788 = fStack_1688 * (float)uStack_1698;
          fStack_2784 = fStack_2784 * uStack_1698._4_4_;
          local_1588 = local_2640;
          local_15a0 = CONCAT44(fStack_278c,local_2790);
          uStack_1598 = CONCAT44(fStack_2784,fStack_2788);
          auVar1._8_8_ = uStack_1598;
          auVar1._0_8_ = local_15a0;
          *(undefined1 (*) [16])*local_2640 = auVar1;
          local_2590 = (undefined1 (*) [64])(*local_2590 + 0x10);
          local_25f0 = (undefined1 (*) [64])(*local_25f0 + 0x10);
          local_2640 = (undefined1 (*) [64])((long)*local_2640 + 0x10);
          local_16a0 = local_27a0;
          uStack_1698 = uStack_2798;
          _local_1690 = auVar2;
        }
        for (; local_268c < local_256c; local_268c = local_268c + 1) {
          *(float *)*local_2640 = *(float *)*local_2590 * *(float *)*local_25f0;
          local_2590 = (undefined1 (*) [64])(*local_2590 + 4);
          local_25f0 = (undefined1 (*) [64])(*local_25f0 + 4);
          local_2640 = (undefined1 (*) [64])((long)*local_2640 + 4);
        }
        local_2428 = local_2580;
        local_4c8 = local_2320;
        local_4a8 = local_2330;
        local_488 = local_2340;
        local_2668 = local_d20;
        local_2618 = local_b28;
        local_25b8 = local_b60;
      }
      for (local_27a8 = 2; uVar29 = local_27a8,
          sVar30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2540),
          uVar29 < sVar30; local_27a8 = local_27a8 + 1) {
        local_27b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_2540,local_27a8);
        for (local_27b4 = 0; local_27b4 < local_2564; local_27b4 = local_27b4 + 1) {
          local_2438 = &local_2808;
          local_ac4 = local_27b0->w;
          local_ac8 = local_27b0->h;
          local_acc = local_27b0->d;
          local_ad8 = (undefined1 (*) [64])
                      ((long)local_27b0->data +
                      local_27b0->cstep * (long)local_27b4 * local_27b0->elemsize);
          local_ae0 = local_27b0->elemsize;
          local_ae4 = local_27b0->elempack;
          local_af0 = local_27b0->allocator;
          local_ac0 = &local_2808;
          local_828 = (long)local_ac4 * (long)local_ac8 * local_ae0;
          local_23b8 = &local_2808;
          local_2310 = &local_2808;
          local_82c = 0x10;
          local_2444 = local_27b4;
          local_2445 = 1;
          local_2808 = 0;
          local_27f8 = 0;
          local_27f0 = 0;
          local_27dc = 0;
          local_27d8 = 0;
          local_27d4 = 0;
          local_27d0 = 0;
          local_2800 = 0;
          local_2130 = &local_2858;
          local_cbc = local_2578->w;
          local_cc0 = local_2578->h;
          local_cc4 = local_2578->d;
          local_cd0 = (undefined1 (*) [64])
                      ((long)local_2578->data +
                      local_2578->cstep * (long)local_27b4 * local_2578->elemsize);
          local_cd8 = local_2578->elemsize;
          local_cdc = local_2578->elempack;
          local_ce8 = local_2578->allocator;
          local_cb8 = &local_2858;
          local_798 = (long)local_cbc * (long)local_cc0 * local_cd8;
          local_79c = 0x10;
          local_2138 = local_2578;
          local_213c = local_27b4;
          local_213d = 1;
          local_27c8 = 0;
          local_27e0 = 0;
          local_20d0 = &local_2858;
          local_2300 = &local_2858;
          local_2858 = 0;
          local_2848 = 0;
          local_2840 = 0;
          local_2830 = 0;
          local_282c = 0;
          local_2828 = 0;
          local_2824 = 0;
          local_2820 = 0;
          local_2818 = 0;
          local_2850 = 0;
          local_2810 = local_cd0;
          local_27c0 = local_ad8;
          for (local_285c = 0; local_285c + 0xf < local_256c; local_285c = local_285c + 0x10) {
            local_2058 = local_2810;
            local_1f80 = *local_2810;
            local_2060 = local_27c0;
            local_2900 = *(undefined8 *)*local_27c0;
            uStack_28f8 = *(undefined8 *)(*local_27c0 + 8);
            uStack_28f0 = *(undefined8 *)(*local_27c0 + 0x10);
            uStack_28e8 = *(undefined8 *)(*local_27c0 + 0x18);
            uStack_28e0 = *(undefined8 *)(*local_27c0 + 0x20);
            uStack_28d8 = *(undefined8 *)(*local_27c0 + 0x28);
            uStack_28d0 = *(undefined8 *)(*local_27c0 + 0x30);
            uStack_28c8 = *(undefined8 *)(*local_27c0 + 0x38);
            local_28c0 = vmulps_avx512f(local_1f80,*local_27c0);
            local_1b48 = local_2810;
            local_1bc0 = local_28c0._0_8_;
            uStack_1bb8 = local_28c0._8_8_;
            uStack_1bb0 = local_28c0._16_8_;
            uStack_1ba8 = local_28c0._24_8_;
            uStack_1ba0 = local_28c0._32_8_;
            uStack_1b98 = local_28c0._40_8_;
            uStack_1b90 = local_28c0._48_8_;
            uStack_1b88 = local_28c0._56_8_;
            *local_2810 = local_28c0;
            local_27c0 = local_27c0 + 1;
            local_2810 = local_2810 + 1;
            local_1fc0 = local_2900;
            uStack_1fb8 = uStack_28f8;
            uStack_1fb0 = uStack_28f0;
            uStack_1fa8 = uStack_28e8;
            uStack_1fa0 = uStack_28e0;
            uStack_1f98 = uStack_28d8;
            uStack_1f90 = uStack_28d0;
            uStack_1f88 = uStack_28c8;
          }
          for (; local_285c + 7 < local_256c; local_285c = local_285c + 8) {
            local_1a78 = local_2810;
            auVar26 = *(undefined1 (*) [12])*local_2810;
            fStack_2914 = (float)((ulong)*(undefined8 *)(*local_2810 + 8) >> 0x20);
            fStack_2910 = (float)*(undefined8 *)(*local_2810 + 0x10);
            fStack_290c = (float)((ulong)*(undefined8 *)(*local_2810 + 0x10) >> 0x20);
            fStack_2908 = (float)*(undefined8 *)(*local_2810 + 0x18);
            uStack_2904 = (undefined4)((ulong)*(undefined8 *)(*local_2810 + 0x18) >> 0x20);
            local_1a80 = local_27c0;
            local_2940 = *(undefined8 *)*local_27c0;
            uStack_2938 = *(undefined8 *)(*local_27c0 + 8);
            uStack_2930 = *(undefined8 *)(*local_27c0 + 0x10);
            uStack_2928 = *(undefined8 *)(*local_27c0 + 0x18);
            auVar13._12_4_ = fStack_2914;
            auVar13._0_12_ = auVar26;
            auVar13._16_4_ = fStack_2910;
            auVar13._20_4_ = fStack_290c;
            auVar13._24_4_ = fStack_2908;
            auVar13._28_4_ = uStack_2904;
            local_1a00._0_4_ = auVar26._0_4_;
            local_1a00._4_4_ = auVar26._4_4_;
            fStack_19f8 = auVar26._8_4_;
            local_1a20._0_4_ = (float)local_2940;
            local_1a20._4_4_ = (float)((ulong)local_2940 >> 0x20);
            uStack_1a18._0_4_ = (float)uStack_2938;
            uStack_1a18._4_4_ = (float)((ulong)uStack_2938 >> 0x20);
            uStack_1a10._0_4_ = (float)uStack_2930;
            uStack_1a10._4_4_ = (float)((ulong)uStack_2930 >> 0x20);
            uStack_1a08._0_4_ = (float)uStack_2928;
            local_2920 = (float)local_1a00._0_4_ * (float)local_1a20;
            fStack_291c = (float)local_1a00._4_4_ * local_1a20._4_4_;
            fStack_2918 = fStack_19f8 * (float)uStack_1a18;
            fStack_2914 = fStack_2914 * uStack_1a18._4_4_;
            fStack_2910 = fStack_2910 * (float)uStack_1a10;
            fStack_290c = fStack_290c * uStack_1a10._4_4_;
            fStack_2908 = fStack_2908 * (float)uStack_1a08;
            local_17e8 = local_2810;
            local_1820 = CONCAT44(fStack_291c,local_2920);
            uStack_1818 = CONCAT44(fStack_2914,fStack_2918);
            uStack_1810 = CONCAT44(fStack_290c,fStack_2910);
            uStack_1808 = CONCAT44(uStack_2904,fStack_2908);
            auVar16._8_8_ = uStack_1818;
            auVar16._0_8_ = local_1820;
            auVar16._16_8_ = uStack_1810;
            auVar16._24_8_ = uStack_1808;
            *(undefined1 (*) [32])*local_2810 = auVar16;
            local_27c0 = (undefined1 (*) [64])(*local_27c0 + 0x20);
            local_2810 = (undefined1 (*) [64])(*local_2810 + 0x20);
            local_1a20 = local_2940;
            uStack_1a18 = uStack_2938;
            uStack_1a10 = uStack_2930;
            uStack_1a08 = uStack_2928;
            _local_1a00 = auVar13;
          }
          for (; local_285c + 3 < local_256c; local_285c = local_285c + 4) {
            local_1738 = local_2810;
            auVar26 = *(undefined1 (*) [12])*local_2810;
            fStack_2944 = (float)((ulong)*(undefined8 *)(*local_2810 + 8) >> 0x20);
            local_1740 = local_27c0;
            local_2960 = *(undefined8 *)*local_27c0;
            uStack_2958 = *(undefined8 *)(*local_27c0 + 8);
            auVar12._12_4_ = fStack_2944;
            auVar12._0_12_ = auVar26;
            local_16b0._0_4_ = auVar26._0_4_;
            local_16b0._4_4_ = auVar26._4_4_;
            fStack_16a8 = auVar26._8_4_;
            local_16c0._0_4_ = (float)local_2960;
            local_16c0._4_4_ = (float)((ulong)local_2960 >> 0x20);
            uStack_16b8._0_4_ = (float)uStack_2958;
            uStack_16b8._4_4_ = (float)((ulong)uStack_2958 >> 0x20);
            local_2950 = (float)local_16b0._0_4_ * (float)local_16c0;
            fStack_294c = (float)local_16b0._4_4_ * local_16c0._4_4_;
            fStack_2948 = fStack_16a8 * (float)uStack_16b8;
            fStack_2944 = fStack_2944 * uStack_16b8._4_4_;
            local_15a8 = local_2810;
            local_15c0 = CONCAT44(fStack_294c,local_2950);
            uStack_15b8 = CONCAT44(fStack_2944,fStack_2948);
            auVar22._8_8_ = uStack_15b8;
            auVar22._0_8_ = local_15c0;
            *(undefined1 (*) [16])*local_2810 = auVar22;
            local_27c0 = (undefined1 (*) [64])(*local_27c0 + 0x10);
            local_2810 = (undefined1 (*) [64])(*local_2810 + 0x10);
            local_16c0 = local_2960;
            uStack_16b8 = uStack_2958;
            _local_16b0 = auVar12;
          }
          for (; local_285c < local_256c; local_285c = local_285c + 1) {
            *(float *)*local_2810 = *(float *)*local_27c0 * *(float *)*local_2810;
            local_27c0 = (undefined1 (*) [64])(*local_27c0 + 4);
            local_2810 = (undefined1 (*) [64])(*local_2810 + 4);
          }
          local_2440 = local_27b0;
          local_508 = local_2300;
          local_4e8 = local_2310;
          local_2838 = local_ce8;
          local_27e8 = local_af0;
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_2968 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2540,1);
        for (local_296c = 0; local_296c < local_2564; local_296c = local_296c + 1) {
          local_2450 = &local_29c0;
          local_a8c = local_2558->w;
          local_a90 = local_2558->h;
          local_a94 = local_2558->d;
          local_aa0 = (undefined1 (*) [64])
                      ((long)local_2558->data +
                      local_2558->cstep * (long)local_296c * local_2558->elemsize);
          local_aa8 = local_2558->elemsize;
          local_aac = local_2558->elempack;
          local_ab8 = local_2558->allocator;
          local_a88 = &local_29c0;
          local_838 = (long)local_a8c * (long)local_a90 * local_aa8;
          local_23c0 = &local_29c0;
          local_22f0 = &local_29c0;
          local_2468 = &local_2a10;
          local_a54 = local_2968->w;
          local_a58 = local_2968->h;
          local_a5c = local_2968->d;
          local_a68 = (undefined1 (*) [64])
                      ((long)local_2968->data +
                      local_2968->cstep * (long)local_296c * local_2968->elemsize);
          local_a70 = local_2968->elemsize;
          local_a74 = local_2968->elempack;
          local_a80 = local_2968->allocator;
          local_a50 = &local_2a10;
          local_848 = (long)local_a54 * (long)local_a58 * local_a70;
          local_23c8 = &local_2a10;
          local_22e0 = &local_2a10;
          local_2988 = 0;
          local_298c = 0;
          local_2990 = 0;
          local_2994 = 0;
          local_29a8 = 0;
          local_29b0 = 0;
          local_29b8 = 0;
          local_29c0 = 0;
          local_83c = 0x10;
          local_84c = 0x10;
          local_2458 = local_2558;
          local_245c = local_296c;
          local_245d = 1;
          local_2474 = local_296c;
          local_2475 = 1;
          local_2980 = 0;
          local_2998 = 0;
          local_2a10 = 0;
          local_2a00 = 0;
          local_29f8 = 0;
          local_29e4 = 0;
          local_29e0 = 0;
          local_29dc = 0;
          local_29d8 = 0;
          local_2a08 = 0;
          local_2150 = &local_2a60;
          local_c84 = local_2578->w;
          local_c88 = local_2578->h;
          local_c8c = local_2578->d;
          local_c98 = (undefined1 (*) [64])
                      ((long)local_2578->data +
                      local_2578->cstep * (long)local_296c * local_2578->elemsize);
          local_ca0 = local_2578->elemsize;
          local_ca4 = local_2578->elempack;
          local_cb0 = local_2578->allocator;
          local_c80 = &local_2a60;
          local_7a8 = (long)local_c84 * (long)local_c88 * local_ca0;
          local_7ac = 0x10;
          local_2158 = local_2578;
          local_215c = local_296c;
          local_215d = 1;
          local_29d0 = 0;
          local_29e8 = 0;
          local_20d8 = &local_2a60;
          local_22d0 = &local_2a60;
          local_2a60 = 0;
          local_2a50 = 0;
          local_2a48 = 0;
          local_2a38 = 0;
          local_2a34 = 0;
          local_2a30 = 0;
          local_2a2c = 0;
          local_2a28 = 0;
          local_2a20 = 0;
          local_2a58 = 0;
          local_2a18 = local_c98;
          local_29c8 = local_a68;
          local_2978 = local_aa0;
          for (local_2a64 = 0; local_2a64 + 0xf < local_256c; local_2a64 = local_2a64 + 0x10) {
            local_2068 = local_2978;
            local_14c0 = *local_2978;
            local_2070 = local_29c8;
            local_2b00 = *(undefined8 *)*local_29c8;
            uStack_2af8 = *(undefined8 *)(*local_29c8 + 8);
            uStack_2af0 = *(undefined8 *)(*local_29c8 + 0x10);
            uStack_2ae8 = *(undefined8 *)(*local_29c8 + 0x18);
            uStack_2ae0 = *(undefined8 *)(*local_29c8 + 0x20);
            uStack_2ad8 = *(undefined8 *)(*local_29c8 + 0x28);
            uStack_2ad0 = *(undefined8 *)(*local_29c8 + 0x30);
            uStack_2ac8 = *(undefined8 *)(*local_29c8 + 0x38);
            local_2ac0 = vaddps_avx512f(local_14c0,*local_29c8);
            local_1bc8 = local_2a18;
            local_1c40 = local_2ac0._0_8_;
            uStack_1c38 = local_2ac0._8_8_;
            uStack_1c30 = local_2ac0._16_8_;
            uStack_1c28 = local_2ac0._24_8_;
            uStack_1c20 = local_2ac0._32_8_;
            uStack_1c18 = local_2ac0._40_8_;
            uStack_1c10 = local_2ac0._48_8_;
            uStack_1c08 = local_2ac0._56_8_;
            *local_2a18 = local_2ac0;
            local_2978 = local_2978 + 1;
            local_29c8 = local_29c8 + 1;
            local_2a18 = local_2a18 + 1;
            local_1500 = local_2b00;
            uStack_14f8 = uStack_2af8;
            uStack_14f0 = uStack_2af0;
            uStack_14e8 = uStack_2ae8;
            uStack_14e0 = uStack_2ae0;
            uStack_14d8 = uStack_2ad8;
            uStack_14d0 = uStack_2ad0;
            uStack_14c8 = uStack_2ac8;
          }
          for (; local_2a64 + 7 < local_256c; local_2a64 = local_2a64 + 8) {
            local_1a88 = local_2978;
            auVar26 = *(undefined1 (*) [12])*local_2978;
            fStack_2b14 = (float)((ulong)*(undefined8 *)(*local_2978 + 8) >> 0x20);
            fStack_2b10 = (float)*(undefined8 *)(*local_2978 + 0x10);
            fStack_2b0c = (float)((ulong)*(undefined8 *)(*local_2978 + 0x10) >> 0x20);
            fStack_2b08 = (float)*(undefined8 *)(*local_2978 + 0x18);
            fStack_2b04 = (float)((ulong)*(undefined8 *)(*local_2978 + 0x18) >> 0x20);
            local_1a90 = local_29c8;
            local_2b40 = *(undefined8 *)*local_29c8;
            uStack_2b38 = *(undefined8 *)(*local_29c8 + 8);
            uStack_2b30 = *(undefined8 *)(*local_29c8 + 0x10);
            uStack_2b28 = *(undefined8 *)(*local_29c8 + 0x18);
            auVar11._12_4_ = fStack_2b14;
            auVar11._0_12_ = auVar26;
            auVar11._16_4_ = fStack_2b10;
            auVar11._20_4_ = fStack_2b0c;
            auVar11._24_4_ = fStack_2b08;
            auVar11._28_4_ = fStack_2b04;
            local_1420._0_4_ = auVar26._0_4_;
            local_1420._4_4_ = auVar26._4_4_;
            fStack_1418 = auVar26._8_4_;
            local_1440._0_4_ = (float)local_2b40;
            local_1440._4_4_ = (float)((ulong)local_2b40 >> 0x20);
            uStack_1438._0_4_ = (float)uStack_2b38;
            uStack_1438._4_4_ = (float)((ulong)uStack_2b38 >> 0x20);
            uStack_1430._0_4_ = (float)uStack_2b30;
            uStack_1430._4_4_ = (float)((ulong)uStack_2b30 >> 0x20);
            uStack_1428._0_4_ = (float)uStack_2b28;
            uStack_1428._4_4_ = (float)((ulong)uStack_2b28 >> 0x20);
            local_2b20 = (float)local_1420._0_4_ + (float)local_1440;
            fStack_2b1c = (float)local_1420._4_4_ + local_1440._4_4_;
            fStack_2b18 = fStack_1418 + (float)uStack_1438;
            fStack_2b14 = fStack_2b14 + uStack_1438._4_4_;
            fStack_2b10 = fStack_2b10 + (float)uStack_1430;
            fStack_2b0c = fStack_2b0c + uStack_1430._4_4_;
            fStack_2b08 = fStack_2b08 + (float)uStack_1428;
            fStack_2b04 = fStack_2b04 + uStack_1428._4_4_;
            local_1828 = local_2a18;
            local_1860 = CONCAT44(fStack_2b1c,local_2b20);
            uStack_1858 = CONCAT44(fStack_2b14,fStack_2b18);
            uStack_1850 = CONCAT44(fStack_2b0c,fStack_2b10);
            uStack_1848 = CONCAT44(fStack_2b04,fStack_2b08);
            auVar15._8_8_ = uStack_1858;
            auVar15._0_8_ = local_1860;
            auVar15._16_8_ = uStack_1850;
            auVar15._24_8_ = uStack_1848;
            *(undefined1 (*) [32])*local_2a18 = auVar15;
            local_2978 = (undefined1 (*) [64])(*local_2978 + 0x20);
            local_29c8 = (undefined1 (*) [64])(*local_29c8 + 0x20);
            local_2a18 = (undefined1 (*) [64])((long)*local_2a18 + 0x20);
            local_1440 = local_2b40;
            uStack_1438 = uStack_2b38;
            uStack_1430 = uStack_2b30;
            uStack_1428 = uStack_2b28;
            _local_1420 = auVar11;
          }
          for (; local_2a64 + 3 < local_256c; local_2a64 = local_2a64 + 4) {
            local_1748 = local_2978;
            auVar26 = *(undefined1 (*) [12])*local_2978;
            fStack_2b44 = (float)((ulong)*(undefined8 *)(*local_2978 + 8) >> 0x20);
            local_1750 = local_29c8;
            local_2b60 = *(undefined8 *)*local_29c8;
            uStack_2b58 = *(undefined8 *)(*local_29c8 + 8);
            auVar10._12_4_ = fStack_2b44;
            auVar10._0_12_ = auVar26;
            local_1380._0_4_ = auVar26._0_4_;
            local_1380._4_4_ = auVar26._4_4_;
            fStack_1378 = auVar26._8_4_;
            local_1390._0_4_ = (float)local_2b60;
            local_1390._4_4_ = (float)((ulong)local_2b60 >> 0x20);
            uStack_1388._0_4_ = (float)uStack_2b58;
            uStack_1388._4_4_ = (float)((ulong)uStack_2b58 >> 0x20);
            local_2b50 = (float)local_1380._0_4_ + (float)local_1390;
            fStack_2b4c = (float)local_1380._4_4_ + local_1390._4_4_;
            fStack_2b48 = fStack_1378 + (float)uStack_1388;
            fStack_2b44 = fStack_2b44 + uStack_1388._4_4_;
            local_15c8 = local_2a18;
            local_15e0 = CONCAT44(fStack_2b4c,local_2b50);
            uStack_15d8 = CONCAT44(fStack_2b44,fStack_2b48);
            auVar21._8_8_ = uStack_15d8;
            auVar21._0_8_ = local_15e0;
            *(undefined1 (*) [16])*local_2a18 = auVar21;
            local_2978 = (undefined1 (*) [64])(*local_2978 + 0x10);
            local_29c8 = (undefined1 (*) [64])(*local_29c8 + 0x10);
            local_2a18 = (undefined1 (*) [64])((long)*local_2a18 + 0x10);
            local_1390 = local_2b60;
            uStack_1388 = uStack_2b58;
            _local_1380 = auVar10;
          }
          for (; local_2a64 < local_256c; local_2a64 = local_2a64 + 1) {
            *(float *)*local_2a18 = *(float *)*local_2978 + *(float *)*local_29c8;
            local_2978 = (undefined1 (*) [64])(*local_2978 + 4);
            local_29c8 = (undefined1 (*) [64])(*local_29c8 + 4);
            local_2a18 = (undefined1 (*) [64])((long)*local_2a18 + 4);
          }
          local_2470 = local_2968;
          local_568 = local_22d0;
          local_548 = local_22e0;
          local_528 = local_22f0;
          local_2a40 = local_cb0;
          local_29f0 = local_a80;
          local_29a0 = local_ab8;
        }
        for (local_2b68 = 2; uVar29 = local_2b68,
            sVar30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2540),
            uVar29 < sVar30; local_2b68 = local_2b68 + 1) {
          local_2b70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_2540,local_2b68);
          for (local_2b74 = 0; local_2b74 < local_2564; local_2b74 = local_2b74 + 1) {
            local_2480 = &local_2bc8;
            local_a1c = local_2b70->w;
            local_a20 = local_2b70->h;
            local_a24 = local_2b70->d;
            local_a30 = (undefined1 (*) [64])
                        ((long)local_2b70->data +
                        local_2b70->cstep * (long)local_2b74 * local_2b70->elemsize);
            local_a38 = local_2b70->elemsize;
            local_a3c = local_2b70->elempack;
            local_a48 = local_2b70->allocator;
            local_a18 = &local_2bc8;
            local_858 = (long)local_a1c * (long)local_a20 * local_a38;
            local_23d0 = &local_2bc8;
            local_22c0 = &local_2bc8;
            local_85c = 0x10;
            local_248c = local_2b74;
            local_248d = 1;
            local_2bc8 = 0;
            local_2bb8 = 0;
            local_2bb0 = 0;
            local_2b9c = 0;
            local_2b98 = 0;
            local_2b94 = 0;
            local_2b90 = 0;
            local_2bc0 = 0;
            local_2170 = &local_2c18;
            local_c4c = local_2578->w;
            local_c50 = local_2578->h;
            local_c54 = local_2578->d;
            local_c60 = (undefined1 (*) [64])
                        ((long)local_2578->data +
                        local_2578->cstep * (long)local_2b74 * local_2578->elemsize);
            local_c68 = local_2578->elemsize;
            local_c6c = local_2578->elempack;
            local_c78 = local_2578->allocator;
            local_c48 = &local_2c18;
            local_7b8 = (long)local_c4c * (long)local_c50 * local_c68;
            local_7bc = 0x10;
            local_2178 = local_2578;
            local_217c = local_2b74;
            local_217d = 1;
            local_2b88 = 0;
            local_2ba0 = 0;
            local_20e0 = &local_2c18;
            local_22b0 = &local_2c18;
            local_2c18 = 0;
            local_2c08 = 0;
            local_2c00 = 0;
            local_2bf0 = 0;
            local_2bec = 0;
            local_2be8 = 0;
            local_2be4 = 0;
            local_2be0 = 0;
            local_2bd8 = 0;
            local_2c10 = 0;
            local_2bd0 = local_c60;
            local_2b80 = local_a30;
            for (local_2c1c = 0; local_2c1c + 0xf < local_256c; local_2c1c = local_2c1c + 0x10) {
              local_2078 = local_2bd0;
              local_1540 = *local_2bd0;
              local_2080 = local_2b80;
              local_2cc0 = *(undefined8 *)*local_2b80;
              uStack_2cb8 = *(undefined8 *)(*local_2b80 + 8);
              uStack_2cb0 = *(undefined8 *)(*local_2b80 + 0x10);
              uStack_2ca8 = *(undefined8 *)(*local_2b80 + 0x18);
              uStack_2ca0 = *(undefined8 *)(*local_2b80 + 0x20);
              uStack_2c98 = *(undefined8 *)(*local_2b80 + 0x28);
              uStack_2c90 = *(undefined8 *)(*local_2b80 + 0x30);
              uStack_2c88 = *(undefined8 *)(*local_2b80 + 0x38);
              local_2c80 = vaddps_avx512f(local_1540,*local_2b80);
              local_1c48 = local_2bd0;
              local_1cc0 = local_2c80._0_8_;
              uStack_1cb8 = local_2c80._8_8_;
              uStack_1cb0 = local_2c80._16_8_;
              uStack_1ca8 = local_2c80._24_8_;
              uStack_1ca0 = local_2c80._32_8_;
              uStack_1c98 = local_2c80._40_8_;
              uStack_1c90 = local_2c80._48_8_;
              uStack_1c88 = local_2c80._56_8_;
              *local_2bd0 = local_2c80;
              local_2b80 = local_2b80 + 1;
              local_2bd0 = local_2bd0 + 1;
              local_1580 = local_2cc0;
              uStack_1578 = uStack_2cb8;
              uStack_1570 = uStack_2cb0;
              uStack_1568 = uStack_2ca8;
              uStack_1560 = uStack_2ca0;
              uStack_1558 = uStack_2c98;
              uStack_1550 = uStack_2c90;
              uStack_1548 = uStack_2c88;
            }
            for (; local_2c1c + 7 < local_256c; local_2c1c = local_2c1c + 8) {
              local_1a98 = local_2bd0;
              auVar26 = *(undefined1 (*) [12])*local_2bd0;
              fStack_2cd4 = (float)((ulong)*(undefined8 *)(*local_2bd0 + 8) >> 0x20);
              fStack_2cd0 = (float)*(undefined8 *)(*local_2bd0 + 0x10);
              fStack_2ccc = (float)((ulong)*(undefined8 *)(*local_2bd0 + 0x10) >> 0x20);
              fStack_2cc8 = (float)*(undefined8 *)(*local_2bd0 + 0x18);
              fStack_2cc4 = (float)((ulong)*(undefined8 *)(*local_2bd0 + 0x18) >> 0x20);
              local_1aa0 = local_2b80;
              local_2d00 = *(undefined8 *)*local_2b80;
              uStack_2cf8 = *(undefined8 *)(*local_2b80 + 8);
              uStack_2cf0 = *(undefined8 *)(*local_2b80 + 0x10);
              uStack_2ce8 = *(undefined8 *)(*local_2b80 + 0x18);
              auVar9._12_4_ = fStack_2cd4;
              auVar9._0_12_ = auVar26;
              auVar9._16_4_ = fStack_2cd0;
              auVar9._20_4_ = fStack_2ccc;
              auVar9._24_4_ = fStack_2cc8;
              auVar9._28_4_ = fStack_2cc4;
              local_1460._0_4_ = auVar26._0_4_;
              local_1460._4_4_ = auVar26._4_4_;
              fStack_1458 = auVar26._8_4_;
              local_1480._0_4_ = (float)local_2d00;
              local_1480._4_4_ = (float)((ulong)local_2d00 >> 0x20);
              uStack_1478._0_4_ = (float)uStack_2cf8;
              uStack_1478._4_4_ = (float)((ulong)uStack_2cf8 >> 0x20);
              uStack_1470._0_4_ = (float)uStack_2cf0;
              uStack_1470._4_4_ = (float)((ulong)uStack_2cf0 >> 0x20);
              uStack_1468._0_4_ = (float)uStack_2ce8;
              uStack_1468._4_4_ = (float)((ulong)uStack_2ce8 >> 0x20);
              local_2ce0 = (float)local_1460._0_4_ + (float)local_1480;
              fStack_2cdc = (float)local_1460._4_4_ + local_1480._4_4_;
              fStack_2cd8 = fStack_1458 + (float)uStack_1478;
              fStack_2cd4 = fStack_2cd4 + uStack_1478._4_4_;
              fStack_2cd0 = fStack_2cd0 + (float)uStack_1470;
              fStack_2ccc = fStack_2ccc + uStack_1470._4_4_;
              fStack_2cc8 = fStack_2cc8 + (float)uStack_1468;
              fStack_2cc4 = fStack_2cc4 + uStack_1468._4_4_;
              local_1868 = local_2bd0;
              local_18a0 = CONCAT44(fStack_2cdc,local_2ce0);
              uStack_1898 = CONCAT44(fStack_2cd4,fStack_2cd8);
              uStack_1890 = CONCAT44(fStack_2ccc,fStack_2cd0);
              uStack_1888 = CONCAT44(fStack_2cc4,fStack_2cc8);
              auVar14._8_8_ = uStack_1898;
              auVar14._0_8_ = local_18a0;
              auVar14._16_8_ = uStack_1890;
              auVar14._24_8_ = uStack_1888;
              *(undefined1 (*) [32])*local_2bd0 = auVar14;
              local_2b80 = (undefined1 (*) [64])(*local_2b80 + 0x20);
              local_2bd0 = (undefined1 (*) [64])(*local_2bd0 + 0x20);
              local_1480 = local_2d00;
              uStack_1478 = uStack_2cf8;
              uStack_1470 = uStack_2cf0;
              uStack_1468 = uStack_2ce8;
              _local_1460 = auVar9;
            }
            for (; local_2c1c + 3 < local_256c; local_2c1c = local_2c1c + 4) {
              local_1758 = local_2bd0;
              auVar26 = *(undefined1 (*) [12])*local_2bd0;
              fStack_2d04 = (float)((ulong)*(undefined8 *)(*local_2bd0 + 8) >> 0x20);
              local_1760 = local_2b80;
              local_2d20 = *(undefined8 *)*local_2b80;
              uStack_2d18 = *(undefined8 *)(*local_2b80 + 8);
              auVar8._12_4_ = fStack_2d04;
              auVar8._0_12_ = auVar26;
              local_13a0._0_4_ = auVar26._0_4_;
              local_13a0._4_4_ = auVar26._4_4_;
              fStack_1398 = auVar26._8_4_;
              local_13b0._0_4_ = (float)local_2d20;
              local_13b0._4_4_ = (float)((ulong)local_2d20 >> 0x20);
              uStack_13a8._0_4_ = (float)uStack_2d18;
              uStack_13a8._4_4_ = (float)((ulong)uStack_2d18 >> 0x20);
              local_2d10 = (float)local_13a0._0_4_ + (float)local_13b0;
              fStack_2d0c = (float)local_13a0._4_4_ + local_13b0._4_4_;
              fStack_2d08 = fStack_1398 + (float)uStack_13a8;
              fStack_2d04 = fStack_2d04 + uStack_13a8._4_4_;
              local_15e8 = local_2bd0;
              local_1600 = CONCAT44(fStack_2d0c,local_2d10);
              uStack_15f8 = CONCAT44(fStack_2d04,fStack_2d08);
              auVar20._8_8_ = uStack_15f8;
              auVar20._0_8_ = local_1600;
              *(undefined1 (*) [16])*local_2bd0 = auVar20;
              local_2b80 = (undefined1 (*) [64])(*local_2b80 + 0x10);
              local_2bd0 = (undefined1 (*) [64])(*local_2bd0 + 0x10);
              local_13b0 = local_2d20;
              uStack_13a8 = uStack_2d18;
              _local_13a0 = auVar8;
            }
            for (; local_2c1c < local_256c; local_2c1c = local_2c1c + 1) {
              *(float *)*local_2bd0 = *(float *)*local_2b80 + *(float *)*local_2bd0;
              local_2b80 = (undefined1 (*) [64])(*local_2b80 + 4);
              local_2bd0 = (undefined1 (*) [64])(*local_2bd0 + 4);
            }
            local_2488 = local_2b70;
            local_5a8 = local_22b0;
            local_588 = local_22c0;
            local_2bf8 = local_c78;
            local_2ba8 = local_a48;
          }
        }
      }
      else {
        local_2d28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2540,1);
        for (local_2d2c = 0; local_2d2c < local_2564; local_2d2c = local_2d2c + 1) {
          local_2498 = &local_2d80;
          local_9e4 = local_2558->w;
          local_9e8 = local_2558->h;
          local_9ec = local_2558->d;
          local_9f8 = (undefined1 (*) [64])
                      ((long)local_2558->data +
                      local_2558->cstep * (long)local_2d2c * local_2558->elemsize);
          local_a00 = local_2558->elemsize;
          local_a04 = local_2558->elempack;
          local_a10 = local_2558->allocator;
          local_9e0 = &local_2d80;
          local_868 = (long)local_9e4 * (long)local_9e8 * local_a00;
          local_23d8 = &local_2d80;
          local_22a0 = &local_2d80;
          local_24b0 = &local_2dd0;
          local_9ac = local_2d28->w;
          local_9b0 = local_2d28->h;
          local_9b4 = local_2d28->d;
          local_9c0 = (undefined1 (*) [64])
                      ((long)local_2d28->data +
                      local_2d28->cstep * (long)local_2d2c * local_2d28->elemsize);
          local_9c8 = local_2d28->elemsize;
          local_9cc = local_2d28->elempack;
          local_9d8 = local_2d28->allocator;
          local_9a8 = &local_2dd0;
          local_878 = (long)local_9ac * (long)local_9b0 * local_9c8;
          local_23e0 = &local_2dd0;
          local_2290 = &local_2dd0;
          local_2d48 = 0;
          local_2d4c = 0;
          local_2d50 = 0;
          local_2d54 = 0;
          local_2d68 = 0;
          local_2d70 = 0;
          local_2d78 = 0;
          local_2d80 = 0;
          local_86c = 0x10;
          local_87c = 0x10;
          local_24a0 = local_2558;
          local_24a4 = local_2d2c;
          local_24a5 = 1;
          local_24bc = local_2d2c;
          local_24bd = 1;
          local_2d40 = 0;
          local_2d58 = 0;
          local_2dd0 = 0;
          local_2dc0 = 0;
          local_2db8 = 0;
          local_2da4 = 0;
          local_2da0 = 0;
          local_2d9c = 0;
          local_2d98 = 0;
          local_2dc8 = 0;
          local_2190 = &local_2e20;
          local_c14 = local_2578->w;
          local_c18 = local_2578->h;
          local_c1c = local_2578->d;
          local_c28 = (undefined1 (*) [16])
                      ((long)local_2578->data +
                      local_2578->cstep * (long)local_2d2c * local_2578->elemsize);
          local_c30 = local_2578->elemsize;
          local_c34 = local_2578->elempack;
          local_c40 = local_2578->allocator;
          local_c10 = &local_2e20;
          local_7c8 = (long)local_c14 * (long)local_c18 * local_c30;
          local_7cc = 0x10;
          local_2198 = local_2578;
          local_219c = local_2d2c;
          local_219d = 1;
          local_2d90 = 0;
          local_2da8 = 0;
          local_20e8 = &local_2e20;
          local_2280 = &local_2e20;
          local_2e20 = 0;
          local_2e10 = 0;
          local_2e08 = 0;
          local_2df8 = 0;
          local_2df4 = 0;
          local_2df0 = 0;
          local_2dec = 0;
          local_2de8 = 0;
          local_2de0 = 0;
          local_2e18 = 0;
          local_1348 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_1350 = 0;
          local_2e24 = *(float *)*local_1348;
          local_1358 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_1360 = 1;
          local_2e28 = *(float *)(*local_1358 + 4);
          local_2e2c = 0;
          local_1240 = vbroadcastss_avx512f(ZEXT416((uint)local_2e24));
          local_2e80 = local_1240._0_8_;
          uStack_2e78 = local_1240._8_8_;
          uStack_2e70 = local_1240._16_8_;
          uStack_2e68 = local_1240._24_8_;
          uStack_2e60 = local_1240._32_8_;
          uStack_2e58 = local_1240._40_8_;
          uStack_2e50 = local_1240._48_8_;
          uStack_2e48 = local_1240._56_8_;
          local_12c0 = vbroadcastss_avx512f(ZEXT416((uint)local_2e28));
          local_2ec0 = local_12c0._0_8_;
          uStack_2eb8 = local_12c0._8_8_;
          uStack_2eb0 = local_12c0._16_8_;
          uStack_2ea8 = local_12c0._24_8_;
          uStack_2ea0 = local_12c0._32_8_;
          uStack_2e98 = local_12c0._40_8_;
          uStack_2e90 = local_12c0._48_8_;
          uStack_2e88 = local_12c0._56_8_;
          local_2dd8 = local_c28;
          local_2d88 = local_9c0;
          local_2d38 = local_9f8;
          for (; local_2e2c + 0xf < local_256c; local_2e2c = local_2e2c + 0x10) {
            local_2088 = local_2d38;
            auVar27 = *(undefined1 (*) [56])*local_2d38;
            uStack_1fc8 = *(undefined8 *)(*local_2d38 + 0x38);
            local_2090 = local_2d88;
            local_2f40 = *(undefined8 *)*local_2d88;
            uStack_2f38 = *(undefined8 *)(*local_2d88 + 8);
            uStack_2f30 = *(undefined8 *)(*local_2d88 + 0x10);
            uStack_2f28 = *(undefined8 *)(*local_2d88 + 0x18);
            uStack_2f20 = *(undefined8 *)(*local_2d88 + 0x20);
            uStack_2f18 = *(undefined8 *)(*local_2d88 + 0x28);
            uStack_2f10 = *(undefined8 *)(*local_2d88 + 0x30);
            uStack_2f08 = *(undefined8 *)(*local_2d88 + 0x38);
            local_2f00._0_8_ = auVar27._0_8_;
            local_2000 = local_2f00._0_8_;
            local_2f00._8_8_ = auVar27._8_8_;
            uStack_1ff8 = local_2f00._8_8_;
            local_2f00._16_8_ = auVar27._16_8_;
            uStack_1ff0 = local_2f00._16_8_;
            local_2f00._24_8_ = auVar27._24_8_;
            uStack_1fe8 = local_2f00._24_8_;
            local_2f00._32_8_ = auVar27._32_8_;
            uStack_1fe0 = local_2f00._32_8_;
            local_2f00._40_8_ = auVar27._40_8_;
            uStack_1fd8 = local_2f00._40_8_;
            local_2f00._48_8_ = auVar27._48_8_;
            uStack_1fd0 = local_2f00._48_8_;
            local_2040 = local_1240._0_8_;
            uStack_2038 = local_1240._8_8_;
            uStack_2030 = local_1240._16_8_;
            uStack_2028 = local_1240._24_8_;
            uStack_2020 = local_1240._32_8_;
            uStack_2018 = local_1240._40_8_;
            uStack_2010 = local_1240._48_8_;
            uStack_2008 = local_1240._56_8_;
            auVar33 = vmulps_avx512f(*local_2d38,local_1240);
            local_10c0 = local_12c0._0_8_;
            uStack_10b8 = local_12c0._8_8_;
            uStack_10b0 = local_12c0._16_8_;
            uStack_10a8 = local_12c0._24_8_;
            uStack_10a0 = local_12c0._32_8_;
            uStack_1098 = local_12c0._40_8_;
            uStack_1090 = local_12c0._48_8_;
            uStack_1088 = local_12c0._56_8_;
            local_2f00._0_8_ = auVar33._0_8_;
            local_1100 = local_2f00._0_8_;
            local_2f00._8_8_ = auVar33._8_8_;
            uStack_10f8 = local_2f00._8_8_;
            local_2f00._16_8_ = auVar33._16_8_;
            uStack_10f0 = local_2f00._16_8_;
            local_2f00._24_8_ = auVar33._24_8_;
            uStack_10e8 = local_2f00._24_8_;
            local_2f00._32_8_ = auVar33._32_8_;
            uStack_10e0 = local_2f00._32_8_;
            local_2f00._40_8_ = auVar33._40_8_;
            uStack_10d8 = local_2f00._40_8_;
            local_2f00._48_8_ = auVar33._48_8_;
            uStack_10d0 = local_2f00._48_8_;
            local_2f00._56_8_ = auVar33._56_8_;
            uStack_10c8 = local_2f00._56_8_;
            local_2f00 = vfmadd213ps_avx512f(local_12c0,*local_2d88,auVar33);
            local_1cc8 = local_2dd8;
            local_1d40 = local_2f00._0_8_;
            uStack_1d38 = local_2f00._8_8_;
            uStack_1d30 = local_2f00._16_8_;
            uStack_1d28 = local_2f00._24_8_;
            uStack_1d20 = local_2f00._32_8_;
            uStack_1d18 = local_2f00._40_8_;
            uStack_1d10 = local_2f00._48_8_;
            uStack_1d08 = local_2f00._56_8_;
            *(undefined8 *)*local_2dd8 = local_2f00._0_8_;
            *(undefined8 *)(*local_2dd8 + 8) = local_2f00._8_8_;
            *(undefined8 *)local_2dd8[1] = local_2f00._16_8_;
            *(undefined8 *)(local_2dd8[1] + 8) = local_2f00._24_8_;
            *(undefined8 *)local_2dd8[2] = local_2f00._32_8_;
            *(undefined8 *)(local_2dd8[2] + 8) = local_2f00._40_8_;
            *(undefined8 *)local_2dd8[3] = local_2f00._48_8_;
            *(undefined8 *)(local_2dd8[3] + 8) = local_2f00._56_8_;
            local_2d38 = local_2d38 + 1;
            local_2d88 = local_2d88 + 1;
            local_2dd8 = local_2dd8 + 4;
            local_1080 = local_2f40;
            uStack_1078 = uStack_2f38;
            uStack_1070 = uStack_2f30;
            uStack_1068 = uStack_2f28;
            uStack_1060 = uStack_2f20;
            uStack_1058 = uStack_2f18;
            uStack_1050 = uStack_2f10;
            uStack_1048 = uStack_2f08;
          }
          auVar2 = vinsertps_avx(ZEXT416((uint)local_2e24),ZEXT416((uint)local_2e24),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2e24),0x20);
          local_1e0 = vinsertps_avx(auVar2,ZEXT416((uint)local_2e24),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_2e24),ZEXT416((uint)local_2e24),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2e24),0x20);
          auStack_1d0 = vinsertps_avx(auVar2,ZEXT416((uint)local_2e24),0x30);
          local_2f60 = local_1e0._0_8_;
          uStack_2f58 = local_1e0._8_8_;
          uStack_2f50 = auStack_1d0._0_8_;
          uStack_2f48 = auStack_1d0._8_8_;
          auVar2 = vinsertps_avx(ZEXT416((uint)local_2e28),ZEXT416((uint)local_2e28),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2e28),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2e28),0x30);
          auVar1 = vinsertps_avx(ZEXT416((uint)local_2e28),ZEXT416((uint)local_2e28),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_2e28),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_2e28),0x30);
          auVar34._16_16_ = auVar2;
          auVar34._0_16_ = auVar1;
          local_1a0._0_8_ = auVar1._0_8_;
          local_1a0._8_8_ = auVar1._8_8_;
          local_1a0._16_8_ = auVar2._0_8_;
          local_1a0._24_8_ = auVar2._8_8_;
          local_2f80 = local_1a0._0_8_;
          uStack_2f78 = local_1a0._8_8_;
          uStack_2f70 = local_1a0._16_8_;
          uStack_2f68 = local_1a0._24_8_;
          for (; local_2e2c + 7 < local_256c; local_2e2c = local_2e2c + 8) {
            local_1aa8 = local_2d38;
            auVar28 = *(undefined1 (*) [24])*local_2d38;
            uVar4 = *(undefined8 *)(*local_2d38 + 0x18);
            local_1ab0 = local_2d88;
            local_2fc0 = *(undefined8 *)*local_2d88;
            uStack_2fb8 = *(undefined8 *)(*local_2d88 + 8);
            uStack_2fb0 = *(undefined8 *)(*local_2d88 + 0x10);
            uStack_2fa8 = *(undefined8 *)(*local_2d88 + 0x18);
            local_2fa0 = auVar28._0_8_;
            uVar5 = local_2fa0;
            uStack_2f98 = auVar28._8_8_;
            uVar6 = uStack_2f98;
            uStack_2f90 = auVar28._16_8_;
            uVar7 = uStack_2f90;
            local_1a40._0_4_ = auVar28._0_4_;
            local_1a40._4_4_ = auVar28._4_4_;
            uStack_1a38._0_4_ = auVar28._8_4_;
            uStack_1a38._4_4_ = auVar28._12_4_;
            uStack_1a30._0_4_ = auVar28._16_4_;
            uStack_1a30._4_4_ = auVar28._20_4_;
            uStack_1a28._0_4_ = (float)uVar4;
            uStack_1a28._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            local_1a60._0_4_ = local_1e0._0_4_;
            local_1a60._4_4_ = local_1e0._4_4_;
            uStack_1a58._0_4_ = local_1e0._8_4_;
            uStack_1a58._4_4_ = local_1e0._12_4_;
            uStack_1a50._0_4_ = auStack_1d0._0_4_;
            uStack_1a50._4_4_ = auStack_1d0._4_4_;
            uStack_1a48._0_4_ = auStack_1d0._8_4_;
            local_2fa0._4_4_ = local_1a40._4_4_ * local_1a60._4_4_;
            local_2fa0._0_4_ = (float)local_1a40 * (float)local_1a60;
            uStack_2f98._0_4_ = (float)uStack_1a38 * (float)uStack_1a58;
            uStack_2f98._4_4_ = uStack_1a38._4_4_ * uStack_1a58._4_4_;
            uStack_2f90._0_4_ = (float)uStack_1a30 * (float)uStack_1a50;
            uStack_2f90._4_4_ = uStack_1a30._4_4_ * uStack_1a50._4_4_;
            auVar28 = _local_2fa0;
            uStack_2f88._0_4_ = (float)uStack_1a28 * (float)uStack_1a48;
            uStack_2f88._4_4_ = uStack_1a28._4_4_;
            auVar3 = _local_2fa0;
            local_fa0 = local_1a0._0_8_;
            uStack_f98 = local_1a0._8_8_;
            uStack_f90 = local_1a0._16_8_;
            uStack_f88 = local_1a0._24_8_;
            local_fc0 = local_2fa0;
            uStack_fb8 = uStack_2f98;
            uStack_2f90 = auVar28._16_8_;
            uStack_fb0 = uStack_2f90;
            uStack_2f88 = auVar3._24_8_;
            uStack_fa8 = uStack_2f88;
            local_100 = local_1a0._0_8_;
            uStack_f8 = local_1a0._8_8_;
            uStack_f0 = local_1a0._16_8_;
            uStack_e8 = local_1a0._24_8_;
            local_120 = local_2fa0;
            uStack_118 = uStack_2f98;
            uStack_110 = uStack_2f90;
            uStack_108 = uStack_2f88;
            auVar24._16_8_ = local_1a0._16_8_;
            auVar24._0_16_ = auVar1;
            auVar24._24_8_ = local_1a0._24_8_;
            auVar23._16_8_ = uStack_2f90;
            auVar23._0_16_ = _local_2fa0;
            auVar23._24_8_ = uStack_2f88;
            auVar2 = vfmadd213ps_fma(auVar24,*(undefined1 (*) [32])*local_2d88,auVar23);
            local_18a8 = local_2dd8;
            local_2fa0 = auVar2._0_8_;
            local_18e0 = local_2fa0;
            uStack_2f98 = auVar2._8_8_;
            uStack_18d8 = uStack_2f98;
            uStack_18d0 = 0;
            uStack_18c8 = 0;
            *(undefined1 (*) [8])*local_2dd8 = local_2fa0;
            *(undefined8 *)(*local_2dd8 + 8) = uStack_2f98;
            *(undefined8 *)local_2dd8[1] = 0;
            *(undefined8 *)(local_2dd8[1] + 8) = 0;
            local_2d38 = (undefined1 (*) [64])(*local_2d38 + 0x20);
            local_2d88 = (undefined1 (*) [64])(*local_2d88 + 0x20);
            local_2dd8 = local_2dd8 + 2;
            _local_2fa0 = ZEXT1632(auVar2);
            local_1a60 = local_1e0._0_8_;
            uStack_1a58 = local_1e0._8_8_;
            uStack_1a50 = auStack_1d0._0_8_;
            uStack_1a48 = auStack_1d0._8_8_;
            local_1a40 = uVar5;
            uStack_1a38 = uVar6;
            uStack_1a30 = uVar7;
            uStack_1a28 = uVar4;
            local_f80 = local_2fc0;
            uStack_f78 = uStack_2fb8;
            uStack_f70 = uStack_2fb0;
            uStack_f68 = uStack_2fa8;
            local_e0 = local_2fc0;
            uStack_d8 = uStack_2fb8;
            uStack_d0 = uStack_2fb0;
            uStack_c8 = uStack_2fa8;
          }
          local_2fd0 = CONCAT44(local_2e24,local_2e24);
          uStack_2fc8 = CONCAT44(local_2e24,local_2e24);
          local_2fe0._8_4_ = local_2e28;
          local_2fe0._0_8_ = CONCAT44(local_2e28,local_2e28);
          local_2fe0._12_4_ = local_2e28;
          for (; local_2e2c + 3 < local_256c; local_2e2c = local_2e2c + 4) {
            local_1768 = local_2d38;
            uVar4 = *(undefined8 *)*local_2d38;
            uVar5 = *(undefined8 *)(*local_2d38 + 8);
            local_1770 = local_2d88;
            uVar6 = *(undefined8 *)*local_2d88;
            uVar7 = *(undefined8 *)(*local_2d88 + 8);
            local_16d0._0_4_ = (float)uVar4;
            local_16d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_16c8._0_4_ = (float)uVar5;
            uStack_16c8._4_4_ = (float)((ulong)uVar5 >> 0x20);
            local_2ff0 = CONCAT44(local_16d0._4_4_ * local_2e24,(float)local_16d0 * local_2e24);
            uStack_2fe8 = CONCAT44(uStack_16c8._4_4_ * local_2e24,(float)uStack_16c8 * local_2e24);
            uStack_16f8 = local_2fe0._8_8_;
            local_16f0._0_4_ = (float)uVar6;
            local_16f0._4_4_ = (float)((ulong)uVar6 >> 0x20);
            uStack_16e8._0_4_ = (float)uVar7;
            uStack_16e8._4_4_ = (float)((ulong)uVar7 >> 0x20);
            local_3000 = (float)local_16f0 * local_2e28;
            fStack_2ffc = local_16f0._4_4_ * local_2e28;
            fStack_2ff8 = (float)uStack_16e8 * local_2e28;
            fStack_2ff4 = uStack_16e8._4_4_ * local_2e28;
            local_13c0._4_4_ = fStack_2ffc;
            local_13c0._0_4_ = local_3000;
            local_13c0._8_4_ = fStack_2ff8;
            local_13c0._12_4_ = fStack_2ff4;
            local_13d0 = local_2ff0;
            uStack_13c8 = uStack_2fe8;
            local_2ff0 = CONCAT44(fStack_2ffc + local_16d0._4_4_ * local_2e24,
                                  local_3000 + (float)local_16d0 * local_2e24);
            uStack_2fe8 = CONCAT44(fStack_2ff4 + uStack_16c8._4_4_ * local_2e24,
                                   fStack_2ff8 + (float)uStack_16c8 * local_2e24);
            local_1608 = local_2dd8;
            local_1620 = local_2ff0;
            uStack_1618 = uStack_2fe8;
            auVar19._8_8_ = uStack_2fe8;
            auVar19._0_8_ = local_2ff0;
            *local_2dd8 = auVar19;
            local_2d38 = (undefined1 (*) [64])(*local_2d38 + 0x10);
            local_2d88 = (undefined1 (*) [64])(*local_2d88 + 0x10);
            local_2dd8 = local_2dd8 + 1;
            local_1700 = CONCAT44(local_2e28,local_2e28);
            local_16f0 = uVar6;
            uStack_16e8 = uVar7;
            local_16e0 = local_2fd0;
            uStack_16d8 = uStack_2fc8;
            local_16d0 = uVar4;
            uStack_16c8 = uVar5;
          }
          for (; local_2e2c < local_256c; local_2e2c = local_2e2c + 1) {
            *(float *)*local_2dd8 =
                 *(float *)*local_2d38 * local_2e24 + *(float *)*local_2d88 * local_2e28;
            local_2d38 = (undefined1 (*) [64])(*local_2d38 + 4);
            local_2d88 = (undefined1 (*) [64])(*local_2d88 + 4);
            local_2dd8 = (undefined1 (*) [16])(*local_2dd8 + 4);
          }
          local_24b8 = local_2d28;
          local_1244 = local_2e28;
          local_11c4 = local_2e24;
          local_1028 = local_2e28;
          local_1024 = local_2e24;
          local_f40 = local_2e28;
          fStack_f3c = local_2e28;
          fStack_f38 = local_2e28;
          fStack_f34 = local_2e28;
          local_f24 = local_2e28;
          local_f20 = local_2e24;
          fStack_f1c = local_2e24;
          fStack_f18 = local_2e24;
          fStack_f14 = local_2e24;
          local_f04 = local_2e24;
          local_608 = local_2280;
          local_5e8 = local_2290;
          local_5c8 = local_22a0;
          local_1c0 = local_2e24;
          local_1bc = local_2e24;
          local_1b8 = local_2e24;
          local_1b4 = local_2e24;
          local_1b0 = local_2e24;
          local_1ac = local_2e24;
          local_1a8 = local_2e24;
          local_1a4 = local_2e24;
          local_1a0 = auVar34;
          local_180 = local_2e28;
          local_17c = local_2e28;
          local_178 = local_2e28;
          local_174 = local_2e28;
          local_170 = local_2e28;
          local_16c = local_2e28;
          local_168 = local_2e28;
          local_164 = local_2e28;
          local_2e00 = local_c40;
          local_2db0 = local_9d8;
          local_2d60 = local_a10;
        }
        for (local_3008 = 2; uVar29 = local_3008,
            sVar30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2540),
            uVar29 < sVar30; local_3008 = local_3008 + 1) {
          local_3010 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_2540,local_3008);
          for (local_3014 = 0; local_3014 < local_2564; local_3014 = local_3014 + 1) {
            local_24c8 = &local_3068;
            local_974 = local_3010->w;
            local_978 = local_3010->h;
            local_97c = local_3010->d;
            local_988 = (undefined1 (*) [64])
                        ((long)local_3010->data +
                        local_3010->cstep * (long)local_3014 * local_3010->elemsize);
            local_990 = local_3010->elemsize;
            local_994 = local_3010->elempack;
            local_9a0 = local_3010->allocator;
            local_970 = &local_3068;
            local_888 = (long)local_974 * (long)local_978 * local_990;
            local_23e8 = &local_3068;
            local_2270 = &local_3068;
            local_88c = 0x10;
            local_24d4 = local_3014;
            local_24d5 = 1;
            local_3068 = 0;
            local_3058 = 0;
            local_3050 = 0;
            local_303c = 0;
            local_3038 = 0;
            local_3034 = 0;
            local_3030 = 0;
            local_3060 = 0;
            local_21b0 = &local_30b8;
            local_bdc = local_2578->w;
            local_be0 = local_2578->h;
            local_be4 = local_2578->d;
            local_bf0 = (undefined1 (*) [64])
                        ((long)local_2578->data +
                        local_2578->cstep * (long)local_3014 * local_2578->elemsize);
            local_bf8 = local_2578->elemsize;
            local_bfc = local_2578->elempack;
            local_c08 = local_2578->allocator;
            local_bd8 = &local_30b8;
            local_7d8 = (long)local_bdc * (long)local_be0 * local_bf8;
            local_7dc = 0x10;
            local_21b8 = local_2578;
            local_21bc = local_3014;
            local_21bd = 1;
            local_3028 = 0;
            local_3040 = 0;
            local_20f0 = &local_30b8;
            local_2260 = &local_30b8;
            local_30b8 = 0;
            local_30a8 = 0;
            local_30a0 = 0;
            local_3090 = 0;
            local_308c = 0;
            local_3088 = 0;
            local_3084 = 0;
            local_3080 = 0;
            local_3078 = 0;
            local_30b0 = 0;
            local_1368 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            local_1370 = local_3008;
            local_30bc = *(float *)(*local_1368 + local_3008 * 4);
            local_30c0 = 0;
            local_1340 = vbroadcastss_avx512f(ZEXT416((uint)local_30bc));
            local_3100 = local_1340._0_8_;
            uStack_30f8 = local_1340._8_8_;
            uStack_30f0 = local_1340._16_8_;
            uStack_30e8 = local_1340._24_8_;
            uStack_30e0 = local_1340._32_8_;
            uStack_30d8 = local_1340._40_8_;
            uStack_30d0 = local_1340._48_8_;
            uStack_30c8 = local_1340._56_8_;
            local_3070 = local_bf0;
            local_3020 = local_988;
            for (; local_30c0 + 0xf < local_256c; local_30c0 = local_30c0 + 0x10) {
              local_2098 = local_3070;
              auVar27 = *(undefined1 (*) [56])*local_3070;
              uStack_1188 = *(undefined8 *)(*local_3070 + 0x38);
              local_20a0 = local_3020;
              local_3180 = *(undefined8 *)*local_3020;
              uStack_3178 = *(undefined8 *)(*local_3020 + 8);
              uStack_3170 = *(undefined8 *)(*local_3020 + 0x10);
              uStack_3168 = *(undefined8 *)(*local_3020 + 0x18);
              uStack_3160 = *(undefined8 *)(*local_3020 + 0x20);
              uStack_3158 = *(undefined8 *)(*local_3020 + 0x28);
              uStack_3150 = *(undefined8 *)(*local_3020 + 0x30);
              uStack_3148 = *(undefined8 *)(*local_3020 + 0x38);
              local_1180 = local_1340._0_8_;
              uStack_1178 = local_1340._8_8_;
              uStack_1170 = local_1340._16_8_;
              uStack_1168 = local_1340._24_8_;
              uStack_1160 = local_1340._32_8_;
              uStack_1158 = local_1340._40_8_;
              uStack_1150 = local_1340._48_8_;
              uStack_1148 = local_1340._56_8_;
              local_3140._0_8_ = auVar27._0_8_;
              local_11c0 = local_3140._0_8_;
              local_3140._8_8_ = auVar27._8_8_;
              uStack_11b8 = local_3140._8_8_;
              local_3140._16_8_ = auVar27._16_8_;
              uStack_11b0 = local_3140._16_8_;
              local_3140._24_8_ = auVar27._24_8_;
              uStack_11a8 = local_3140._24_8_;
              local_3140._32_8_ = auVar27._32_8_;
              uStack_11a0 = local_3140._32_8_;
              local_3140._40_8_ = auVar27._40_8_;
              uStack_1198 = local_3140._40_8_;
              local_3140._48_8_ = auVar27._48_8_;
              uStack_1190 = local_3140._48_8_;
              local_3140 = vfmadd213ps_avx512f(local_1340,*local_3020,*local_3070);
              local_1d48 = local_3070;
              local_1dc0 = local_3140._0_8_;
              uStack_1db8 = local_3140._8_8_;
              uStack_1db0 = local_3140._16_8_;
              uStack_1da8 = local_3140._24_8_;
              uStack_1da0 = local_3140._32_8_;
              uStack_1d98 = local_3140._40_8_;
              uStack_1d90 = local_3140._48_8_;
              uStack_1d88 = local_3140._56_8_;
              *(undefined8 *)*local_3070 = local_3140._0_8_;
              *(undefined8 *)(*local_3070 + 8) = local_3140._8_8_;
              *(undefined8 *)(*local_3070 + 0x10) = local_3140._16_8_;
              *(undefined8 *)(*local_3070 + 0x18) = local_3140._24_8_;
              *(undefined8 *)(*local_3070 + 0x20) = local_3140._32_8_;
              *(undefined8 *)(*local_3070 + 0x28) = local_3140._40_8_;
              *(undefined8 *)(*local_3070 + 0x30) = local_3140._48_8_;
              *(undefined8 *)(*local_3070 + 0x38) = local_3140._56_8_;
              local_3020 = local_3020 + 1;
              local_3070 = local_3070 + 1;
              local_1140 = local_3180;
              uStack_1138 = uStack_3178;
              uStack_1130 = uStack_3170;
              uStack_1128 = uStack_3168;
              uStack_1120 = uStack_3160;
              uStack_1118 = uStack_3158;
              uStack_1110 = uStack_3150;
              uStack_1108 = uStack_3148;
            }
            auVar2 = vinsertps_avx(ZEXT416((uint)local_30bc),ZEXT416((uint)local_30bc),0x10);
            auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_30bc),0x20);
            auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_30bc),0x30);
            auVar1 = vinsertps_avx(ZEXT416((uint)local_30bc),ZEXT416((uint)local_30bc),0x10);
            auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_30bc),0x20);
            auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_30bc),0x30);
            auVar35._16_16_ = auVar2;
            auVar35._0_16_ = auVar1;
            local_160._0_8_ = auVar1._0_8_;
            local_160._8_8_ = auVar1._8_8_;
            local_160._16_8_ = auVar2._0_8_;
            local_160._24_8_ = auVar2._8_8_;
            local_31a0 = local_160._0_8_;
            uStack_3198 = local_160._8_8_;
            uStack_3190 = local_160._16_8_;
            uStack_3188 = local_160._24_8_;
            for (; local_30c0 + 7 < local_256c; local_30c0 = local_30c0 + 8) {
              local_1ab8 = local_3070;
              auVar28 = *(undefined1 (*) [24])*local_3070;
              uStack_1008 = *(undefined8 *)(*local_3070 + 0x18);
              local_1ac0 = local_3020;
              local_31e0 = *(undefined8 *)*local_3020;
              uStack_31d8 = *(undefined8 *)(*local_3020 + 8);
              uStack_31d0 = *(undefined8 *)(*local_3020 + 0x10);
              uStack_31c8 = *(undefined8 *)(*local_3020 + 0x18);
              local_1000 = local_160._0_8_;
              uStack_ff8 = local_160._8_8_;
              uStack_ff0 = local_160._16_8_;
              uStack_fe8 = local_160._24_8_;
              local_31c0._0_8_ = auVar28._0_8_;
              local_1020 = local_31c0._0_8_;
              local_31c0._8_8_ = auVar28._8_8_;
              uStack_1018 = local_31c0._8_8_;
              local_31c0._16_8_ = auVar28._16_8_;
              uStack_1010 = local_31c0._16_8_;
              local_a0 = local_160._0_8_;
              uStack_98 = local_160._8_8_;
              uStack_90 = local_160._16_8_;
              uStack_88 = local_160._24_8_;
              local_c0 = local_31c0._0_8_;
              uStack_b8 = local_31c0._8_8_;
              uStack_b0 = local_31c0._16_8_;
              auVar25._16_8_ = local_160._16_8_;
              auVar25._0_16_ = auVar1;
              auVar25._24_8_ = local_160._24_8_;
              auVar2 = vfmadd213ps_fma(auVar25,*(undefined1 (*) [32])*local_3020,
                                       *(undefined1 (*) [32])*local_3070);
              local_18e8 = local_3070;
              local_31c0._0_8_ = auVar2._0_8_;
              local_1920 = local_31c0._0_8_;
              local_31c0._8_8_ = auVar2._8_8_;
              uStack_1918 = local_31c0._8_8_;
              uStack_1910 = 0;
              uStack_1908 = 0;
              *(undefined8 *)*local_3070 = local_31c0._0_8_;
              *(undefined8 *)(*local_3070 + 8) = local_31c0._8_8_;
              *(undefined8 *)(*local_3070 + 0x10) = 0;
              *(undefined8 *)(*local_3070 + 0x18) = 0;
              local_3020 = (undefined1 (*) [64])(*local_3020 + 0x20);
              local_3070 = (undefined1 (*) [64])(*local_3070 + 0x20);
              local_31c0 = ZEXT1632(auVar2);
              local_fe0 = local_31e0;
              uStack_fd8 = uStack_31d8;
              uStack_fd0 = uStack_31d0;
              uStack_fc8 = uStack_31c8;
              uStack_a8 = uStack_1008;
              local_80 = local_31e0;
              uStack_78 = uStack_31d8;
              uStack_70 = uStack_31d0;
              uStack_68 = uStack_31c8;
            }
            local_31f0._8_4_ = local_30bc;
            local_31f0._0_8_ = CONCAT44(local_30bc,local_30bc);
            local_31f0._12_4_ = local_30bc;
            for (; local_30c0 + 3 < local_256c; local_30c0 = local_30c0 + 4) {
              local_1778 = local_3020;
              uVar4 = *(undefined8 *)*local_3020;
              uVar5 = *(undefined8 *)(*local_3020 + 8);
              local_1780 = local_3070;
              uVar6 = *(undefined8 *)*local_3070;
              uVar7 = *(undefined8 *)(*local_3070 + 8);
              uStack_1718 = local_31f0._8_8_;
              local_1710._0_4_ = (float)uVar4;
              local_1710._4_4_ = (float)((ulong)uVar4 >> 0x20);
              uStack_1708._0_4_ = (float)uVar5;
              uStack_1708._4_4_ = (float)((ulong)uVar5 >> 0x20);
              local_3200 = (float)local_1710 * local_30bc;
              fStack_31fc = local_1710._4_4_ * local_30bc;
              fStack_31f8 = (float)uStack_1708 * local_30bc;
              fStack_31f4 = uStack_1708._4_4_ * local_30bc;
              local_13e0._4_4_ = fStack_31fc;
              local_13e0._0_4_ = local_3200;
              local_13e0._8_4_ = fStack_31f8;
              local_13e0._12_4_ = fStack_31f4;
              local_13f0._0_4_ = (float)uVar6;
              local_13f0._4_4_ = (float)((ulong)uVar6 >> 0x20);
              uStack_13e8._0_4_ = (float)uVar7;
              uStack_13e8._4_4_ = (float)((ulong)uVar7 >> 0x20);
              local_3210 = CONCAT44(fStack_31fc + local_13f0._4_4_,local_3200 + (float)local_13f0);
              uStack_3208 = CONCAT44(fStack_31f4 + uStack_13e8._4_4_,
                                     fStack_31f8 + (float)uStack_13e8);
              local_1628 = local_3070;
              local_1640 = local_3210;
              uStack_1638 = uStack_3208;
              auVar18._8_8_ = uStack_3208;
              auVar18._0_8_ = local_3210;
              *(undefined1 (*) [16])*local_3070 = auVar18;
              local_3020 = (undefined1 (*) [64])(*local_3020 + 0x10);
              local_3070 = (undefined1 (*) [64])(*local_3070 + 0x10);
              local_1720 = CONCAT44(local_30bc,local_30bc);
              local_1710 = uVar4;
              uStack_1708 = uVar5;
              local_13f0 = uVar6;
              uStack_13e8 = uVar7;
            }
            for (; local_30c0 < local_256c; local_30c0 = local_30c0 + 1) {
              *(float *)*local_3070 = *(float *)*local_3020 * local_30bc + *(float *)*local_3070;
              local_3020 = (undefined1 (*) [64])(*local_3020 + 4);
              local_3070 = (undefined1 (*) [64])(*local_3070 + 4);
            }
            local_24d0 = local_3010;
            local_12c4 = local_30bc;
            local_102c = local_30bc;
            local_f60 = local_30bc;
            fStack_f5c = local_30bc;
            fStack_f58 = local_30bc;
            fStack_f54 = local_30bc;
            local_f44 = local_30bc;
            local_648 = local_2260;
            local_628 = local_2270;
            local_160 = auVar35;
            local_140 = local_30bc;
            local_13c = local_30bc;
            local_138 = local_30bc;
            local_134 = local_30bc;
            local_130 = local_30bc;
            local_12c = local_30bc;
            local_128 = local_30bc;
            local_124 = local_30bc;
            local_3098 = local_c08;
            local_3048 = local_9a0;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_3218 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2540,1);
      for (local_321c = 0; local_321c < local_2564; local_321c = local_321c + 1) {
        local_24e0 = &local_3270;
        local_93c = local_2558->w;
        local_940 = local_2558->h;
        local_944 = local_2558->d;
        local_950 = (undefined1 (*) [64])
                    ((long)local_2558->data +
                    local_2558->cstep * (long)local_321c * local_2558->elemsize);
        local_958 = local_2558->elemsize;
        local_95c = local_2558->elempack;
        local_968 = local_2558->allocator;
        local_938 = &local_3270;
        local_898 = (long)local_93c * (long)local_940 * local_958;
        local_23f0 = &local_3270;
        local_2250 = &local_3270;
        local_24f8 = &local_32c0;
        local_904 = local_3218->w;
        local_908 = local_3218->h;
        local_90c = local_3218->d;
        local_918 = (undefined1 (*) [64])
                    ((long)local_3218->data +
                    local_3218->cstep * (long)local_321c * local_3218->elemsize);
        local_920 = local_3218->elemsize;
        local_924 = local_3218->elempack;
        local_930 = local_3218->allocator;
        local_900 = &local_32c0;
        local_8a8 = (long)local_904 * (long)local_908 * local_920;
        local_23f8 = &local_32c0;
        local_2240 = &local_32c0;
        local_21d0 = &local_3310;
        local_ba4 = local_2578->w;
        local_ba8 = local_2578->h;
        local_bac = local_2578->d;
        local_bb8 = (undefined1 (*) [64])
                    ((long)local_2578->data +
                    local_2578->cstep * (long)local_321c * local_2578->elemsize);
        local_bc0 = local_2578->elemsize;
        local_bc4 = local_2578->elempack;
        local_bd0 = local_2578->allocator;
        local_ba0 = &local_3310;
        local_7e8 = (long)local_ba4 * (long)local_ba8 * local_bc0;
        local_20f8 = &local_3310;
        local_2230 = &local_3310;
        local_3238 = 0;
        local_323c = 0;
        local_3240 = 0;
        local_3244 = 0;
        local_3258 = 0;
        local_3260 = 0;
        local_3268 = 0;
        local_3270 = 0;
        local_3288 = 0;
        local_328c = 0;
        local_3290 = 0;
        local_3294 = 0;
        local_32a8 = 0;
        local_32b0 = 0;
        local_32b8 = 0;
        local_32c0 = 0;
        local_7ec = 0x10;
        local_89c = 0x10;
        local_8ac = 0x10;
        local_21d8 = local_2578;
        local_21dc = local_321c;
        local_21dd = 1;
        local_24e8 = local_2558;
        local_24ec = local_321c;
        local_24ed = 1;
        local_2500 = local_3218;
        local_2504 = local_321c;
        local_2505 = 1;
        local_3230 = 0;
        local_3248 = 0;
        local_3280 = 0;
        local_3298 = 0;
        local_3310 = 0;
        local_3300 = 0;
        local_32f8 = 0;
        local_32e8 = 0;
        local_32e4 = 0;
        local_32e0 = 0;
        local_32dc = 0;
        local_32d8 = 0;
        local_32d0 = 0;
        local_3308 = 0;
        local_32c8 = local_bb8;
        local_3278 = local_918;
        local_3228 = local_950;
        for (local_3314 = 0; local_3314 + 0xf < local_256c; local_3314 = local_3314 + 0x10) {
          local_20a8 = local_3228;
          auVar27 = *(undefined1 (*) [56])*local_3228;
          uStack_e08 = *(undefined8 *)(*local_3228 + 0x38);
          local_20b0 = local_3278;
          local_33c0 = *(undefined8 *)*local_3278;
          uStack_33b8 = *(undefined8 *)(*local_3278 + 8);
          uStack_33b0 = *(undefined8 *)(*local_3278 + 0x10);
          uStack_33a8 = *(undefined8 *)(*local_3278 + 0x18);
          uStack_33a0 = *(undefined8 *)(*local_3278 + 0x20);
          uStack_3398 = *(undefined8 *)(*local_3278 + 0x28);
          uStack_3390 = *(undefined8 *)(*local_3278 + 0x30);
          uStack_3388 = *(undefined8 *)(*local_3278 + 0x38);
          local_3380._0_8_ = auVar27._0_8_;
          local_e40 = local_3380._0_8_;
          local_3380._8_8_ = auVar27._8_8_;
          uStack_e38 = local_3380._8_8_;
          local_3380._16_8_ = auVar27._16_8_;
          uStack_e30 = local_3380._16_8_;
          local_3380._24_8_ = auVar27._24_8_;
          uStack_e28 = local_3380._24_8_;
          local_3380._32_8_ = auVar27._32_8_;
          uStack_e20 = local_3380._32_8_;
          local_3380._40_8_ = auVar27._40_8_;
          uStack_e18 = local_3380._40_8_;
          local_3380._48_8_ = auVar27._48_8_;
          uStack_e10 = local_3380._48_8_;
          local_3380 = vmaxps_avx512f(*local_3228,*local_3278);
          local_1dc8 = local_32c8;
          local_1e40 = local_3380._0_8_;
          uStack_1e38 = local_3380._8_8_;
          uStack_1e30 = local_3380._16_8_;
          uStack_1e28 = local_3380._24_8_;
          uStack_1e20 = local_3380._32_8_;
          uStack_1e18 = local_3380._40_8_;
          uStack_1e10 = local_3380._48_8_;
          uStack_1e08 = local_3380._56_8_;
          *local_32c8 = local_3380;
          local_3228 = local_3228 + 1;
          local_3278 = local_3278 + 1;
          local_32c8 = local_32c8 + 1;
          local_e80 = local_33c0;
          uStack_e78 = uStack_33b8;
          uStack_e70 = uStack_33b0;
          uStack_e68 = uStack_33a8;
          uStack_e60 = uStack_33a0;
          uStack_e58 = uStack_3398;
          uStack_e50 = uStack_3390;
          uStack_e48 = uStack_3388;
        }
        for (; local_3314 + 7 < local_256c; local_3314 = local_3314 + 8) {
          local_1ac8 = local_3228;
          auVar28 = *(undefined1 (*) [24])*local_3228;
          uStack_d88 = *(undefined8 *)(*local_3228 + 0x18);
          local_1ad0 = local_3278;
          local_3400 = *(undefined8 *)*local_3278;
          uStack_33f8 = *(undefined8 *)(*local_3278 + 8);
          uStack_33f0 = *(undefined8 *)(*local_3278 + 0x10);
          uStack_33e8 = *(undefined8 *)(*local_3278 + 0x18);
          local_33e0._0_8_ = auVar28._0_8_;
          local_da0 = local_33e0._0_8_;
          local_33e0._8_8_ = auVar28._8_8_;
          uStack_d98 = local_33e0._8_8_;
          local_33e0._16_8_ = auVar28._16_8_;
          uStack_d90 = local_33e0._16_8_;
          local_33e0 = vmaxps_avx(*(undefined1 (*) [32])*local_3228,
                                  *(undefined1 (*) [32])*local_3278);
          local_1928 = local_32c8;
          local_1960 = local_33e0._0_8_;
          uStack_1958 = local_33e0._8_8_;
          uStack_1950 = local_33e0._16_8_;
          uStack_1948 = local_33e0._24_8_;
          *(undefined1 (*) [32])*local_32c8 = local_33e0;
          local_3228 = (undefined1 (*) [64])(*local_3228 + 0x20);
          local_3278 = (undefined1 (*) [64])(*local_3278 + 0x20);
          local_32c8 = (undefined1 (*) [64])((long)*local_32c8 + 0x20);
          local_dc0 = local_3400;
          uStack_db8 = uStack_33f8;
          uStack_db0 = uStack_33f0;
          uStack_da8 = uStack_33e8;
        }
        for (; local_6a8 = local_2230, local_688 = local_2240, local_668 = local_2250,
            local_32f0 = local_bd0, local_32a0 = local_930, local_3250 = local_968,
            local_3314 + 3 < local_256c; local_3314 = local_3314 + 4) {
          local_1788 = local_3228;
          local_d40 = *(undefined8 *)*local_3228;
          uStack_d38 = *(undefined8 *)(*local_3228 + 8);
          local_1790 = local_3278;
          local_3420 = *(undefined8 *)*local_3278;
          uStack_3418 = *(undefined8 *)(*local_3278 + 8);
          local_3410 = vmaxps_avx(*(undefined1 (*) [16])*local_3228,
                                  *(undefined1 (*) [16])*local_3278);
          local_1648 = local_32c8;
          local_1660 = local_3410._0_8_;
          uStack_1658 = local_3410._8_8_;
          *(undefined1 (*) [16])*local_32c8 = local_3410;
          local_3228 = (undefined1 (*) [64])(*local_3228 + 0x10);
          local_3278 = (undefined1 (*) [64])(*local_3278 + 0x10);
          local_32c8 = (undefined1 (*) [64])((long)*local_32c8 + 0x10);
          local_d50 = local_3420;
          uStack_d48 = uStack_3418;
        }
        for (; local_3314 < local_256c; local_3314 = local_3314 + 1) {
          pfVar31 = std::max<float>((float *)local_3228,(float *)local_3278);
          *(float *)*local_32c8 = *pfVar31;
          local_3228 = (undefined1 (*) [64])(*local_3228 + 4);
          local_3278 = (undefined1 (*) [64])(*local_3278 + 4);
          local_32c8 = (undefined1 (*) [64])((long)*local_32c8 + 4);
        }
      }
      for (local_3428 = 2; uVar29 = local_3428,
          sVar30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2540),
          uVar29 < sVar30; local_3428 = local_3428 + 1) {
        local_3430 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_2540,local_3428);
        for (local_3434 = 0; local_3434 < local_2564; local_3434 = local_3434 + 1) {
          local_2510 = &local_3488;
          local_8cc = local_3430->w;
          local_8d0 = local_3430->h;
          local_8d4 = local_3430->d;
          local_8e0 = (undefined1 (*) [64])
                      ((long)local_3430->data +
                      local_3430->cstep * (long)local_3434 * local_3430->elemsize);
          local_8e8 = local_3430->elemsize;
          local_8ec = local_3430->elempack;
          local_8f8 = local_3430->allocator;
          local_8c8 = &local_3488;
          local_8b8 = (long)local_8cc * (long)local_8d0 * local_8e8;
          local_2400 = &local_3488;
          local_2220 = &local_3488;
          local_21f0 = &local_34d8;
          local_b6c = local_2578->w;
          local_b70 = local_2578->h;
          local_b74 = local_2578->d;
          local_b80 = (undefined1 (*) [64])
                      ((long)local_2578->data +
                      local_2578->cstep * (long)local_3434 * local_2578->elemsize);
          local_b88 = local_2578->elemsize;
          local_b8c = local_2578->elempack;
          local_b98 = local_2578->allocator;
          local_b68 = &local_34d8;
          local_7f8 = (long)local_b6c * (long)local_b70 * local_b88;
          local_2100 = &local_34d8;
          local_2210 = &local_34d8;
          local_3450 = 0;
          local_3454 = 0;
          local_3458 = 0;
          local_345c = 0;
          local_3470 = 0;
          local_3478 = 0;
          local_3480 = 0;
          local_3488 = 0;
          local_7fc = 0x10;
          local_8bc = 0x10;
          local_21f8 = local_2578;
          local_21fc = local_3434;
          local_21fd = 1;
          local_2518 = local_3430;
          local_251c = local_3434;
          local_251d = 1;
          local_3448 = 0;
          local_3460 = 0;
          local_34d8 = 0;
          local_34c8 = 0;
          local_34c0 = 0;
          local_34b0 = 0;
          local_34ac = 0;
          local_34a8 = 0;
          local_34a4 = 0;
          local_34a0 = 0;
          local_3498 = 0;
          local_34d0 = 0;
          local_3490 = local_b80;
          local_3440 = local_8e0;
          for (local_34dc = 0; local_34dc + 0xf < local_256c; local_34dc = local_34dc + 0x10) {
            local_20b8 = local_3490;
            auVar27 = *(undefined1 (*) [56])*local_3490;
            uStack_e88 = *(undefined8 *)(*local_3490 + 0x38);
            local_20c0 = local_3440;
            local_f00 = *(undefined8 *)*local_3440;
            uStack_ef8 = *(undefined8 *)(*local_3440 + 8);
            uStack_ef0 = *(undefined8 *)(*local_3440 + 0x10);
            uStack_ee8 = *(undefined8 *)(*local_3440 + 0x18);
            uStack_ee0 = *(undefined8 *)(*local_3440 + 0x20);
            uStack_ed8 = *(undefined8 *)(*local_3440 + 0x28);
            uStack_ed0 = *(undefined8 *)(*local_3440 + 0x30);
            uStack_ec8 = *(undefined8 *)(*local_3440 + 0x38);
            local_3540 = auVar27._0_8_;
            local_ec0 = local_3540;
            uStack_3538 = auVar27._8_8_;
            uStack_eb8 = uStack_3538;
            uStack_3530 = auVar27._16_8_;
            uStack_eb0 = uStack_3530;
            uStack_3528 = auVar27._24_8_;
            uStack_ea8 = uStack_3528;
            uStack_3520 = auVar27._32_8_;
            uStack_ea0 = uStack_3520;
            uStack_3518 = auVar27._40_8_;
            uStack_e98 = uStack_3518;
            uStack_3510 = auVar27._48_8_;
            uStack_e90 = uStack_3510;
            auVar33 = vmaxps_avx512f(*local_3490,*local_3440);
            local_1e48 = local_3490;
            local_3540 = auVar33._0_8_;
            local_1ec0 = local_3540;
            uStack_3538 = auVar33._8_8_;
            uStack_1eb8 = uStack_3538;
            uStack_3530 = auVar33._16_8_;
            uStack_1eb0 = uStack_3530;
            uStack_3528 = auVar33._24_8_;
            uStack_1ea8 = uStack_3528;
            uStack_3520 = auVar33._32_8_;
            uStack_1ea0 = uStack_3520;
            uStack_3518 = auVar33._40_8_;
            uStack_1e98 = uStack_3518;
            uStack_3510 = auVar33._48_8_;
            uStack_1e90 = uStack_3510;
            uStack_3508 = auVar33._56_8_;
            uStack_1e88 = uStack_3508;
            *local_3490 = auVar33;
            local_3440 = local_3440 + 1;
            local_3490 = local_3490 + 1;
          }
          for (; local_34dc + 7 < local_256c; local_34dc = local_34dc + 8) {
            local_1ad8 = local_3490;
            auVar28 = *(undefined1 (*) [24])*local_3490;
            uStack_dc8 = *(undefined8 *)(*local_3490 + 0x18);
            local_1ae0 = local_3440;
            local_e00 = *(undefined8 *)*local_3440;
            uStack_df8 = *(undefined8 *)(*local_3440 + 8);
            uStack_df0 = *(undefined8 *)(*local_3440 + 0x10);
            uStack_de8 = *(undefined8 *)(*local_3440 + 0x18);
            local_35a0 = auVar28._0_8_;
            local_de0 = local_35a0;
            uStack_3598 = auVar28._8_8_;
            uStack_dd8 = uStack_3598;
            uStack_3590 = auVar28._16_8_;
            uStack_dd0 = uStack_3590;
            auVar3 = vmaxps_avx(*(undefined1 (*) [32])*local_3490,*(undefined1 (*) [32])*local_3440)
            ;
            local_1968 = local_3490;
            local_35a0 = auVar3._0_8_;
            local_19a0 = local_35a0;
            uStack_3598 = auVar3._8_8_;
            uStack_1998 = uStack_3598;
            uStack_3590 = auVar3._16_8_;
            uStack_1990 = uStack_3590;
            uStack_3588 = auVar3._24_8_;
            uStack_1988 = uStack_3588;
            *(undefined1 (*) [32])*local_3490 = auVar3;
            local_3440 = (undefined1 (*) [64])(*local_3440 + 0x20);
            local_3490 = (undefined1 (*) [64])(*local_3490 + 0x20);
          }
          for (; local_6e8 = local_2210, local_6c8 = local_2220, local_34b8 = local_b98,
              local_3468 = local_8f8, local_34dc + 3 < local_256c; local_34dc = local_34dc + 4) {
            local_1798 = local_3490;
            local_d60 = *(undefined8 *)*local_3490;
            uStack_d58 = *(undefined8 *)(*local_3490 + 8);
            local_17a0 = local_3440;
            local_d70 = *(undefined8 *)*local_3440;
            uStack_d68 = *(undefined8 *)(*local_3440 + 8);
            auVar2 = vmaxps_avx(*(undefined1 (*) [16])*local_3490,*(undefined1 (*) [16])*local_3440)
            ;
            local_1668 = local_3490;
            local_35d0 = auVar2._0_8_;
            local_1680 = local_35d0;
            uStack_35c8 = auVar2._8_8_;
            uStack_1678 = uStack_35c8;
            *(undefined1 (*) [16])*local_3490 = auVar2;
            local_3440 = (undefined1 (*) [64])(*local_3440 + 0x10);
            local_3490 = (undefined1 (*) [64])(*local_3490 + 0x10);
          }
          for (; local_34dc < local_256c; local_34dc = local_34dc + 1) {
            pfVar31 = std::max<float>((float *)local_3440,(float *)local_3490);
            *(float *)*local_3490 = *pfVar31;
            local_3440 = (undefined1 (*) [64])(*local_3440 + 4);
            local_3490 = (undefined1 (*) [64])(*local_3490 + 4);
          }
        }
      }
    }
    local_252c = 0;
  }
  return local_252c;
}

Assistant:

int Eltwise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}